

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

SampledSpectrum __thiscall
pbrt::VolPathIntegrator::SampleLd
          (VolPathIntegrator *this,Interaction *intr,BSDF *bsdf,SampledWavelengths *lambda,
          SamplerHandle *sampler,SampledSpectrum *beta,SampledSpectrum *pathPDF)

{
  Vector3f *pVVar1;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar2;
  float **ppfVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  short sVar49;
  ushort uVar50;
  undefined8 uVar51;
  Vector3f wiRender;
  undefined4 uVar52;
  undefined4 uVar53;
  undefined4 uVar54;
  undefined4 uVar55;
  undefined4 uVar56;
  undefined4 uVar57;
  undefined4 uVar58;
  undefined4 uVar59;
  Tuple3<pbrt::Vector3,_float> woRender;
  undefined1 *puVar60;
  undefined1 *puVar61;
  anon_struct_8_0_00000001_for___align aVar62;
  anon_struct_8_0_00000001_for___align aVar63;
  anon_struct_8_0_00000001_for___align aVar64;
  Point3fi *pPVar65;
  Point3fi *pPVar66;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  TVar67;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  TVar68;
  undefined8 uVar69;
  int i;
  SurfaceInteraction *pSVar70;
  MediumInteraction *pMVar71;
  byte bVar72;
  DebugMLTSampler *this_00;
  ExhaustiveLightSampler *this_01;
  long lVar73;
  int iVar74;
  HaltonSampler *this_02;
  ulong uVar75;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar76;
  ulong uVar77;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar78;
  uint uVar79;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar80;
  size_t *psVar81;
  VolPathIntegrator *pVVar82;
  uintptr_t iptr;
  DenselySampledSpectrum *this_03;
  float *pfVar83;
  long in_FS_OFFSET;
  bool bVar84;
  int iVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 in_ZmmResult [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar111 [48];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  float z;
  Float u;
  float fVar112;
  float fVar113;
  Interval<float> i_00;
  Interval<float> i_01;
  Interval<float> i_02;
  Interval<float> i_03;
  Interval<float> i_04;
  Interval<float> i_05;
  float fVar114;
  Interval<float> IVar116;
  Interval<float> i_06;
  Interval<float> i_07;
  undefined4 extraout_XMM0_Db;
  undefined8 uVar115;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar131 [64];
  undefined1 extraout_var_02 [56];
  undefined1 auVar132 [64];
  undefined1 extraout_var_04 [56];
  undefined1 auVar133 [64];
  undefined1 extraout_var_06 [56];
  undefined1 auVar134 [64];
  undefined4 extraout_XMM0_Dd;
  undefined1 extraout_var [60];
  undefined1 auVar135 [64];
  undefined1 auVar136 [64];
  undefined1 auVar137 [64];
  undefined1 auVar155 [56];
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  undefined1 auVar142 [64];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  undefined1 auVar145 [64];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  undefined1 auVar149 [64];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  undefined1 auVar152 [64];
  undefined1 auVar153 [64];
  undefined1 auVar154 [64];
  float y;
  undefined8 uVar157;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar156;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar186 [56];
  undefined1 auVar172 [64];
  undefined1 auVar173 [64];
  undefined1 auVar174 [64];
  undefined1 auVar175 [64];
  undefined1 auVar176 [64];
  undefined1 auVar177 [64];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  float x;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 in_ZMM2 [64];
  float fVar193;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  float fVar200;
  float fVar201;
  undefined1 auVar202 [64];
  float fVar203;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar207;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  Float t0;
  float fVar216;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [64];
  undefined1 in_ZMM11 [64];
  undefined1 auVar223 [64];
  undefined1 in_ZMM13 [64];
  undefined1 auVar224 [64];
  undefined1 in_XMM15 [16];
  SampledSpectrum SVar225;
  Vector3f wiRender_00;
  Ray lightRay;
  RNG rng;
  int voxel [3];
  float nextCrossingT [3];
  optional<pbrt::SampledLight> sampledLight;
  Point3fi o;
  int step [3];
  float deltaT [3];
  SampledSpectrum pdfLight;
  SampledSpectrum throughput;
  SampledSpectrum betaLight;
  LightSampleContext ctx;
  int voxelLimit [3];
  SampledSpectrum pdfUni;
  optional<pbrt::ShapeIntersection> si;
  LightLiSample ls;
  undefined1 local_578 [16];
  undefined1 local_568 [16];
  undefined1 local_548 [8];
  undefined8 uStack_540;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  undefined1 local_528 [8];
  float fStack_520;
  float fStack_51c;
  undefined1 local_518 [12];
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  float fStack_500;
  undefined4 uStack_4fc;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_4f8;
  undefined1 local_4e8 [16];
  RNG local_4d8;
  Tuple3<pbrt::Point3,_float> local_4c8;
  float local_4b8;
  int local_4b4 [3];
  float local_4a8;
  float local_4a4;
  undefined1 local_4a0 [8];
  Interval<float> IStack_498;
  Interval<float> local_490;
  undefined1 local_488 [16];
  undefined8 local_478;
  float local_46c;
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  undefined1 local_448 [16];
  undefined1 local_438 [16];
  VolPathIntegrator *local_420;
  undefined1 local_418 [16];
  Interval<float> aIStack_408 [17];
  bool local_380;
  SampledSpectrum local_378;
  anon_class_32_4_b07b4888 local_368;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  int aiStack_330 [3];
  float afStack_324 [3];
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [16];
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  SampledSpectrum local_2e8;
  float local_2d8;
  float afStack_2d4 [3];
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined1 local_2b8 [16];
  Interval<float> local_2a8;
  Interval<float> IStack_2a0;
  Interval<float> IStack_298;
  undefined8 uStack_290;
  float fStack_288;
  undefined4 uStack_284;
  undefined4 uStack_280;
  float fStack_27c;
  int aiStack_274 [3];
  undefined1 local_268 [16];
  SampledSpectrum local_258;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [4];
  float fStack_1d4;
  Interval<float> IStack_1d0;
  Interval<float> IStack_1c8;
  undefined1 auStack_1c0 [12];
  undefined8 uStack_1b4;
  float fStack_1ac;
  undefined1 auStack_1a8 [16];
  undefined1 local_198 [64];
  undefined1 local_158 [64];
  undefined1 local_118 [64];
  ulong local_d8;
  anon_struct_8_0_00000001_for___align local_d0;
  Float local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined1 local_b8 [16];
  float local_a8;
  float afStack_a4 [3];
  ulong local_98;
  float local_90;
  float local_8c;
  Interaction local_80;
  undefined1 auVar96 [64];
  undefined1 auVar102 [64];
  undefined1 auVar108 [64];
  undefined1 auVar88 [16];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  undefined1 extraout_var_10 [56];
  undefined1 extraout_var_11 [56];
  undefined1 extraout_var_12 [56];
  undefined1 extraout_var_13 [56];
  undefined1 extraout_var_14 [56];
  undefined1 extraout_var_15 [56];
  undefined1 extraout_var_16 [56];
  undefined1 auVar171 [64];
  
  IStack_498 = (Interval<float>)local_4a0;
  auVar91 = in_ZMM13._0_16_;
  auVar87 = in_ZMM11._0_16_;
  auVar86 = in_ZMM2._0_16_;
  _local_1d8 = (sampler->
               super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
               ).bits;
  u = detail::DispatchSplit<8>::operator()
                ((DispatchSplit<8> *)local_418,local_1d8,(ulong)_local_1d8 >> 0x30);
  auVar223 = _local_1d8;
  local_420 = this;
  if (bsdf == (BSDF *)0x0) {
    IStack_1c8 = (intr->pi).super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
    auVar224 = _local_1d8;
    uVar56 = (intr->pi).super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
    uVar57 = (intr->pi).super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
    fStack_1d4 = (float)uVar57;
    local_1d8 = (undefined1  [4])uVar56;
    uVar58 = (intr->pi).super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
    uVar59 = (intr->pi).super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
    IStack_1d0.high = (float)uVar59;
    IStack_1d0.low = (float)uVar58;
    _IStack_1c8 = auVar224._16_48_;
    _auStack_1c0 = ZEXT816(0) << 0x20;
    auStack_1a8 = auVar223._48_16_;
    stack0xfffffffffffffe50 = 0;
    uVar75 = (this->lightSampler).
             super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
             .bits;
    sVar49 = (short)(uVar75 >> 0x30);
    if (uVar75 < 0x3000000000000) {
      if (sVar49 != 2) goto LAB_00418826;
LAB_004187b7:
      PowerLightSampler::Sample
                ((optional<pbrt::SampledLight> *)local_488,
                 (PowerLightSampler *)(uVar75 & 0xffffffffffff),u);
    }
    else {
      this_01 = (ExhaustiveLightSampler *)(uVar75 & 0xffffffffffff);
      if (sVar49 != 3) goto LAB_004188c7;
LAB_0041889e:
      BVHLightSampler::Sample
                ((optional<pbrt::SampledLight> *)local_488,(BVHLightSampler *)this_01,
                 (LightSampleContext *)local_1d8,u);
    }
  }
  else {
    pSVar70 = Interaction::AsSurface(intr);
    auVar223 = _local_1d8;
    IStack_1c8 = (pSVar70->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
    auVar224 = _local_1d8;
    pPVar65 = &(pSVar70->super_Interaction).pi;
    pPVar66 = &(pSVar70->super_Interaction).pi;
    uVar52 = (pPVar65->super_Point3<pbrt::Interval<float>_>).
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
    uVar53 = (pPVar65->super_Point3<pbrt::Interval<float>_>).
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
    fStack_1d4 = (float)uVar53;
    local_1d8 = (undefined1  [4])uVar52;
    uVar54 = (pPVar66->super_Point3<pbrt::Interval<float>_>).
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
    uVar55 = (pPVar66->super_Point3<pbrt::Interval<float>_>).
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
    IStack_1d0.high = (float)uVar55;
    IStack_1d0.low = (float)uVar54;
    _IStack_1c8 = auVar224._16_48_;
    auVar224 = _local_1d8;
    _uStack_1b4 = auVar223._36_28_;
    _local_1d8 = auVar224._0_32_;
    auStack_1c0._8_4_ = (pSVar70->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar202 = _local_1d8;
    uVar5 = (pSVar70->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
    uVar7 = (pSVar70->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
    auStack_1c0._4_4_ = uVar7;
    auStack_1c0._0_4_ = uVar5;
    stack0xfffffffffffffe48 = auVar202._32_32_;
    _local_1d8 = auVar224._0_24_;
    auVar224 = _local_1d8;
    auStack_1a8 = auVar223._48_16_;
    _local_1d8 = auVar224._0_44_;
    fStack_1ac = (pSVar70->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar223 = _local_1d8;
    uVar6 = (pSVar70->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
    uVar8 = (pSVar70->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
    uStack_1b4._4_4_ = uVar8;
    uStack_1b4._0_4_ = uVar6;
    _fStack_1ac = auVar223._44_20_;
    _local_1d8 = auVar224._0_36_;
    uVar75 = (this->lightSampler).
             super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
             .bits;
    sVar49 = (short)(uVar75 >> 0x30);
    if (uVar75 < 0x3000000000000) {
      if (sVar49 == 2) goto LAB_004187b7;
LAB_00418826:
      lVar73 = *(long *)((uVar75 & 0xffffffffffff) + 0x18);
      if (lVar73 == 0) {
        local_488._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_488._8_8_ = 0;
        local_478._0_1_ = false;
        local_478._1_7_ = 0;
      }
      else {
        auVar86 = vcvtusi2ss_avx512f(auVar86,lVar73);
        iVar74 = (int)(u * auVar86._0_4_);
        iVar85 = (int)lVar73 + -1;
        if (iVar74 <= iVar85) {
          iVar85 = iVar74;
        }
        local_488._0_8_ =
             *(anon_struct_8_0_00000001_for___align *)
              (*(long *)((uVar75 & 0xffffffffffff) + 8) + (long)iVar85 * 8);
        local_478._0_1_ = true;
        local_488._8_4_ = 1.0 / auVar86._0_4_;
      }
    }
    else {
      this_01 = (ExhaustiveLightSampler *)(uVar75 & 0xffffffffffff);
      if (sVar49 == 3) goto LAB_0041889e;
LAB_004188c7:
      ExhaustiveLightSampler::Sample
                ((optional<pbrt::SampledLight> *)local_488,this_01,(LightSampleContext *)local_1d8,u
                );
    }
  }
  uVar75 = (sampler->
           super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
           ).bits;
  uVar50 = (ushort)(uVar75 >> 0x30);
  if (uVar75 >> 0x30 < 5) {
    this_02 = (HaltonSampler *)(uVar75 & 0xffffffffffff);
    if (uVar75 < 0x3000000000000) {
      if (uVar50 == 2) {
        auVar131._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)this_02);
        auVar131._8_56_ = extraout_var_01;
        auVar86 = auVar131._0_16_;
      }
      else {
        auVar133._0_8_ = HaltonSampler::Get2D(this_02);
        auVar133._8_56_ = extraout_var_05;
        auVar86 = auVar133._0_16_;
      }
    }
    else if (uVar50 == 3) {
      auVar132._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)this_02);
      auVar132._8_56_ = extraout_var_03;
      auVar86 = auVar132._0_16_;
    }
    else {
      auVar134._0_8_ = RandomSampler::Get2D((RandomSampler *)this_02);
      auVar134._8_56_ = extraout_var_07;
      auVar86 = auVar134._0_16_;
    }
  }
  else {
    this_00 = (DebugMLTSampler *)(uVar75 & 0xffffffffffff);
    if (uVar50 < 7) {
      if (uVar50 == 6) {
        auVar222._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)this_00);
        auVar222._8_56_ = extraout_var_02;
        auVar86 = auVar222._0_16_;
      }
      else {
        auVar202._0_8_ = SobolSampler::Get2D((SobolSampler *)this_00);
        auVar202._8_56_ = extraout_var_06;
        auVar86 = auVar202._0_16_;
      }
    }
    else if (uVar50 == 7) {
      auVar224._0_8_ = MLTSampler::Get2D((MLTSampler *)this_00);
      auVar224._8_56_ = extraout_var_04;
      auVar86 = auVar224._0_16_;
    }
    else {
      local_578._0_4_ = DebugMLTSampler::Get1D(this_00);
      local_578._4_4_ = extraout_XMM0_Db;
      local_578._8_4_ = extraout_XMM0_Dc;
      local_578._12_4_ = extraout_XMM0_Dd;
      auVar223._0_4_ = DebugMLTSampler::Get1D(this_00);
      auVar223._4_60_ = extraout_var;
      auVar86 = vinsertps_avx(local_578,auVar223._0_16_,0x10);
    }
  }
  auVar223 = _local_1d8;
  uVar69 = local_488._0_8_;
  uVar157 = 0;
  uVar115 = 0;
  if (local_478._0_1_ != false) {
    if ((anon_struct_8_0_00000001_for___align)local_488._0_8_ !=
        (anon_struct_8_0_00000001_for___align)0x0) {
      if (((float)local_488._8_4_ != 0.0) || (NAN((float)local_488._8_4_))) {
        fStack_288 = 0.0;
        uStack_284 = 0;
        uStack_280 = 0;
        fStack_27c = 0.0;
        local_2a8.low = 0.0;
        local_2a8.high = 0.0;
        IStack_2a0.low = 0.0;
        IStack_2a0.high = 0.0;
        IStack_298.low = 0.0;
        IStack_298.high = 0.0;
        uStack_290 = 0;
        if (bsdf == (BSDF *)0x0) {
          IStack_298 = (intr->pi).super_Point3<pbrt::Interval<float>_>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
          IStack_1c8 = IStack_298;
          auVar160._0_4_ =
               (intr->pi).super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
          auVar160._4_4_ =
               (intr->pi).super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
          auVar160._8_4_ =
               (intr->pi).super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
          auVar160._12_4_ =
               (intr->pi).super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
          _local_1d8 = auVar160;
          _auStack_1c0 = ZEXT816(0) << 0x20;
          auStack_1a8 = auVar223._48_16_;
          stack0xfffffffffffffe50 = 0;
          local_2a8.low = (float)auVar160._0_4_;
          local_2a8.high = (float)auVar160._4_4_;
          IStack_2a0.low = (float)auVar160._8_4_;
          IStack_2a0.high = (float)auVar160._12_4_;
          uStack_290 = 0;
          fStack_288 = 0.0;
          uStack_284 = 0;
          uStack_280 = 0;
          fStack_27c = 0.0;
        }
        else {
          pSVar70 = Interaction::AsSurface(intr);
          auVar223 = _local_1d8;
          IStack_298 = (pSVar70->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
          IStack_1c8 = IStack_298;
          pPVar65 = &(pSVar70->super_Interaction).pi;
          pPVar66 = &(pSVar70->super_Interaction).pi;
          auVar188._0_4_ =
               (pPVar65->super_Point3<pbrt::Interval<float>_>).
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
          auVar188._4_4_ =
               (pPVar65->super_Point3<pbrt::Interval<float>_>).
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
          auVar188._8_4_ =
               (pPVar66->super_Point3<pbrt::Interval<float>_>).
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
          auVar188._12_4_ =
               (pPVar66->super_Point3<pbrt::Interval<float>_>).
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
          _local_1d8 = auVar188;
          auVar224 = _local_1d8;
          fStack_288 = (pSVar70->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
          _uStack_1b4 = auVar223._36_28_;
          _local_1d8 = auVar224._0_32_;
          auStack_1c0._8_4_ = fStack_288;
          uStack_290._0_4_ = (pSVar70->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
          uStack_290._4_4_ = (pSVar70->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
          _local_1d8 = auVar224._0_24_;
          auStack_1c0._0_8_ = uStack_290;
          uVar157._0_4_ = (pSVar70->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
          uVar157._4_4_ = (pSVar70->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
          uStack_1b4 = uVar157;
          fStack_27c = (pSVar70->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
          auStack_1a8 = auVar223._48_16_;
          fStack_1ac = fStack_27c;
          local_2a8.low = (float)auVar188._0_4_;
          local_2a8.high = (float)auVar188._4_4_;
          IStack_2a0.low = (float)auVar188._8_4_;
          IStack_2a0.high = (float)auVar188._12_4_;
          uStack_284 = (undefined4)uVar157;
          uStack_280 = uVar157._4_4_;
        }
        auVar223 = _local_1d8;
        IStack_1c8 = IStack_298;
        auStack_1c0._0_8_ = uStack_290;
        auStack_1c0._8_4_ = fStack_288;
        uStack_1b4._4_4_ = uStack_280;
        uStack_1b4._0_4_ = uStack_284;
        auStack_1a8 = auVar223._48_16_;
        fStack_1ac = fStack_27c;
        auVar223 = _local_1d8;
        IStack_1d0 = IStack_2a0;
        _local_1d8 = local_2a8;
        stack0xfffffffffffffe48 = auVar223._32_32_;
        local_518._0_8_ = *(undefined8 *)(lambda->lambda).values;
        uVar157 = *(undefined8 *)((lambda->lambda).values + 2);
        uVar115 = *(undefined8 *)(lambda->pdf).values;
        uVar51 = *(undefined8 *)((lambda->pdf).values + 2);
        aIStack_408[0] = (Interval<float>)local_518;
        local_518._8_4_ = (undefined4)uVar157;
        fStack_50c = (float)((ulong)uVar157 >> 0x20);
        fStack_508 = (float)uVar115;
        fStack_504 = (float)((ulong)uVar115 >> 0x20);
        fStack_500 = (float)uVar51;
        uStack_4fc = (undefined4)((ulong)uVar51 >> 0x20);
        local_418._8_8_ = local_4a0;
        local_4a0 = (undefined1  [8])vmovlps_avx(auVar86);
        aIStack_408[1] = (Interval<float>)&local_2c8;
        local_2c8 = (ulong)(uint)local_2c8._4_4_ << 0x20;
        local_368.throughput = (SampledSpectrum *)uVar69;
        local_d0 = (anon_struct_8_0_00000001_for___align)uVar69;
        auVar223 = ZEXT1664(auVar87);
        auVar224 = ZEXT1664(auVar91);
        local_418._0_8_ = local_1d8;
        detail::DispatchSplit<9>::operator()(&local_a8);
        pVVar82 = local_420;
        auVar111 = in_ZmmResult._16_48_;
        uVar157 = 0;
        if (0.0 < local_8c) {
          if ((local_a8 == 0.0) && (!NAN(local_a8))) {
            uVar75 = 0;
            while (uVar77 = uVar75, uVar77 != 3) {
              if ((afStack_a4[uVar77] != 0.0) || (uVar75 = uVar77 + 1, NAN(afStack_a4[uVar77])))
              break;
            }
            uVar115 = 0;
            if (2 < uVar77) goto LAB_0041c67d;
          }
          if (local_478._0_1_ == false) {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x3089585);
          }
          local_b8 = ZEXT416((uint)(local_8c * (float)local_488._8_4_));
          local_2c8 = *(long *)(beta->values).values;
          uStack_2c0 = *(undefined8 *)((beta->values).values + 2);
          pVVar1 = &intr->wo;
          local_548._0_4_ = (pVVar1->super_Tuple3<pbrt::Vector3,_float>).x;
          local_548._4_4_ = (pVVar1->super_Tuple3<pbrt::Vector3,_float>).y;
          fVar114 = (intr->wo).super_Tuple3<pbrt::Vector3,_float>.z;
          woRender = pVVar1->super_Tuple3<pbrt::Vector3,_float>;
          wiRender.super_Tuple3<pbrt::Vector3,_float>.z = local_90;
          wiRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_98;
          wiRender.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_98._4_4_;
          uStack_540 = 0;
          _fStack_520 = 0;
          local_528 = (undefined1  [8])local_98;
          if (bsdf == (BSDF *)0x0) {
            fVar113 = (intr->n).super_Tuple3<pbrt::Normal3,_float>.x;
            if (((((fVar113 != 0.0) || (NAN(fVar113))) ||
                 (fVar113 = (intr->n).super_Tuple3<pbrt::Normal3,_float>.y, fVar113 != 0.0)) ||
                ((NAN(fVar113) ||
                 (fVar113 = (intr->n).super_Tuple3<pbrt::Normal3,_float>.z, fVar113 != 0.0)))) ||
               (NAN(fVar113))) {
              LogFatal<char_const(&)[27]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp"
                         ,0x522,"Check failed: %s",(char (*) [27])"intr.IsMediumInteraction()");
            }
            pMVar71 = Interaction::AsMedium(intr);
            pfVar83 = (float *)((pMVar71->phase).super_TaggedPointer<pbrt::HGPhaseFunction>.bits &
                               0xffffffffffff);
            auVar86._0_4_ = (float)local_548._0_4_ * (float)local_98;
            auVar86._4_4_ = (float)local_548._4_4_ * (float)(local_98 >> 0x20);
            auVar86._8_8_ = 0;
            auVar86 = vmovshdup_avx(auVar86);
            auVar86 = vfmadd231ss_fma(auVar86,_local_548,_local_528);
            auVar87 = vfmadd132ss_fma(ZEXT416((uint)local_90),auVar86,ZEXT416((uint)fVar114));
            fVar114 = *pfVar83;
            auVar86 = vfmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)fVar114),
                                      ZEXT416((uint)fVar114));
            auVar91 = vfmadd213ss_fma(ZEXT416((uint)(fVar114 + fVar114)),auVar87,auVar86);
            auVar160 = ZEXT816(0) << 0x40;
            auVar86 = vmaxss_avx(auVar91,auVar160);
            if (auVar86._0_4_ < 0.0) {
              fVar113 = sqrtf(auVar86._0_4_);
              auVar160 = ZEXT816(0) << 0x40;
            }
            else {
              auVar86 = vsqrtss_avx(auVar86,auVar86);
              fVar113 = auVar86._0_4_;
            }
            auVar188 = SUB6416(ZEXT464(0x3f800000),0);
            auVar86 = vfnmadd213ss_fma(ZEXT416((uint)fVar114),ZEXT416((uint)fVar114),auVar188);
            fVar114 = (auVar86._0_4_ * 0.07957747) / (fVar113 * auVar91._0_4_);
            local_2c8 = CONCAT44(fVar114 * local_2c8._4_4_,fVar114 * (float)local_2c8);
            uStack_2c0 = CONCAT44(fVar114 * uStack_2c0._4_4_,fVar114 * (float)uStack_2c0);
            fVar114 = *pfVar83;
            auVar86 = vfmadd213ss_fma(ZEXT416((uint)fVar114),ZEXT416((uint)fVar114),auVar188);
            auVar202 = ZEXT464((uint)(fVar114 + fVar114));
            auVar87 = vfmadd213ss_fma(ZEXT416(auVar87._0_4_),ZEXT416((uint)(fVar114 + fVar114)),
                                      auVar86);
            auVar91 = vfnmadd213ss_fma(ZEXT416((uint)fVar114),ZEXT416((uint)fVar114),auVar188);
            auVar86 = vmaxss_avx(auVar87,auVar160);
            if (auVar86._0_4_ < 0.0) {
              fVar114 = sqrtf(auVar86._0_4_);
            }
            else {
              auVar86 = vsqrtss_avx(auVar86,auVar86);
              fVar114 = auVar86._0_4_;
            }
            local_c8 = (auVar91._0_4_ * 0.07957747) / (fVar114 * auVar87._0_4_);
            uStack_c4 = 0;
            uStack_c0 = 0;
            uStack_bc = 0;
          }
          else {
            auVar186 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
            uVar157 = 0;
            SVar225 = BSDF::f(bsdf,(Vector3f)pVVar1->super_Tuple3<pbrt::Vector3,_float>,wiRender,
                              Radiance);
            pVVar82 = local_420;
            auVar171._0_8_ = SVar225.values.values._8_8_;
            auVar171._8_56_ = auVar186;
            local_4e8._8_8_ = uVar157;
            local_4e8._0_8_ = SVar225.values.values._0_8_;
            pSVar70 = Interaction::AsSurface(intr);
            fVar114 = (pSVar70->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
            auVar87 = vunpcklpd_avx(local_4e8,auVar171._0_16_);
            auVar86 = vmovshdup_avx(_local_528);
            fVar113 = local_90 * fVar114;
            auVar202 = ZEXT464((uint)fVar113);
            auVar86 = vfmadd132ss_fma(auVar86,ZEXT416((uint)fVar113),
                                      ZEXT416((uint)(pSVar70->shading).n.
                                                    super_Tuple3<pbrt::Normal3,_float>.y));
            auVar91 = vfmsub213ss_fma(ZEXT416((uint)fVar114),ZEXT416((uint)local_90),
                                      ZEXT416((uint)fVar113));
            auVar86 = vfmadd231ss_fma(ZEXT416((uint)(auVar86._0_4_ + auVar91._0_4_)),_local_528,
                                      ZEXT416((uint)(pSVar70->shading).n.
                                                    super_Tuple3<pbrt::Normal3,_float>.x));
            auVar88._0_4_ = auVar86._0_4_;
            auVar88._4_4_ = auVar88._0_4_;
            auVar88._8_4_ = auVar88._0_4_;
            auVar88._12_4_ = auVar88._0_4_;
            auVar91._8_4_ = 0x7fffffff;
            auVar91._0_8_ = 0x7fffffff7fffffff;
            auVar91._12_4_ = 0x7fffffff;
            in_ZmmResult._0_16_ = vandps_avx512vl(auVar88,auVar91);
            in_ZmmResult._16_48_ = auVar111;
            local_2c8 = CONCAT44(in_ZmmResult._4_4_ * auVar87._4_4_ * local_2c8._4_4_,
                                 in_ZmmResult._0_4_ * auVar87._0_4_ * (float)local_2c8);
            uStack_2c0 = CONCAT44(in_ZmmResult._12_4_ * auVar87._12_4_ * uStack_2c0._4_4_,
                                  in_ZmmResult._8_4_ * auVar87._8_4_ * (float)uStack_2c0);
            wiRender_00.super_Tuple3<pbrt::Vector3,_float>.z = local_90;
            wiRender_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_98;
            wiRender_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_98._4_4_;
            local_c8 = BSDF::PDF(bsdf,(Vector3f)woRender,wiRender_00,Radiance,All);
            uStack_c4 = extraout_XMM0_Db_00;
            uStack_c0 = extraout_XMM0_Dc_00;
            uStack_bc = extraout_XMM0_Dd_00;
          }
          if (((float)local_2c8 == 0.0) && (!NAN((float)local_2c8))) {
            uVar75 = 0;
            while (uVar77 = uVar75, uVar77 != 3) {
              fVar114 = *(float *)((long)&local_2c8 + uVar77 * 4 + 4);
              if ((fVar114 != 0.0) || (uVar75 = uVar77 + 1, NAN(fVar114))) break;
            }
            uVar157 = 0;
            uVar115 = 0;
            if (2 < uVar77) goto LAB_0041c67d;
          }
          Interaction::SpawnRayTo((Ray *)local_518,intr,&local_80);
          puVar60 = (undefined1 *)CONCAT44(fStack_50c,local_518._8_4_);
          local_2d8 = 1.0;
          afStack_2d4[0] = 1.0;
          afStack_2d4[1] = 1.0;
          afStack_2d4[2] = 1.0;
          local_2e8.values.values[0] = 1.0;
          local_2e8.values.values[1] = 1.0;
          local_2e8.values.values[2] = 1.0;
          local_2e8.values.values[3] = 1.0;
          local_258.values.values[0] = 1.0;
          local_258.values.values[1] = 1.0;
          local_258.values.values[2] = 1.0;
          local_258.values.values[3] = 1.0;
          uVar75 = ((((ulong)(local_518._0_8_ * -0x395b586ca42e166b) >> 0x2f ^
                     local_518._0_8_ * -0x395b586ca42e166b) * -0x395b586ca42e166b ^
                    0x4fb7dae84dd6f2fc) * -0x395b586ca42e166b ^ (ulong)(uint)local_518._8_4_) *
                   -0x395b586ca42e166b;
          uVar77 = (uVar75 >> 0x2f ^ uVar75) * -0x395b586ca42e166b;
          uVar77 = uVar77 >> 0x2f ^ uVar77;
          uVar75 = CONCAT44(fStack_508,fStack_50c) * -0x395b586ca42e166b;
          uVar75 = (((uVar75 >> 0x2f ^ uVar75) * -0x395b586ca42e166b ^ 0x4fb7dae84dd6f2fc) *
                    -0x395b586ca42e166b ^ (ulong)(uint)fStack_504) * -0x395b586ca42e166b;
          uVar75 = (uVar75 >> 0x2f ^ uVar75) * -0x395b586ca42e166b;
          local_4d8.inc = uVar77 * 2 + 1;
          local_4d8.state =
               ((uVar75 >> 0x2f ^ uVar75) + 1) * 0x5851f42d4c957f2d + uVar77 * -0x4f5c17a566d501a4 +
               1;
          pVVar82 = (VolPathIntegrator *)
                    &(pVVar82->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.
                     aggregate;
          local_420 = pVVar82;
          do {
            *(long *)(in_FS_OFFSET + -0x380) = *(long *)(in_FS_OFFSET + -0x380) + 1;
            if (((((PrimitiveHandle *)pVVar82)->
                 super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                 ).bits & 0xffffffffffff) == 0) {
              in_ZmmResult = ZEXT1664(ZEXT816(0) << 0x40);
              local_118 = in_ZmmResult;
              local_158 = in_ZmmResult;
              local_198 = in_ZmmResult;
              _local_1d8 = in_ZmmResult;
              local_d8 = 0;
            }
            else {
              auVar202 = ZEXT1664(auVar202._0_16_);
              auVar223 = ZEXT1664(auVar223._0_16_);
              auVar224 = ZEXT1664(auVar224._0_16_);
              unique0x100091fd = puVar60;
              PrimitiveHandle::Intersect
                        ((optional<pbrt::ShapeIntersection> *)local_1d8,(PrimitiveHandle *)pVVar82,
                         (Ray *)local_518,0.9999);
              puVar60 = stack0xfffffffffffffaf0;
            }
            TVar67.bits = local_4f8.bits;
            fStack_50c = (float)((ulong)puVar60 >> 0x20);
            auVar91 = auVar224._0_16_;
            auVar87 = auVar223._0_16_;
            auVar86 = auVar202._0_16_;
            if ((local_d8._0_1_ != true) ||
               (iVar85 = 1, (local_118 & (undefined1  [64])0xffffffffffff) == (undefined1  [64])0x0)
               ) {
              if ((float **)local_4f8.bits != (float **)0x0) {
                fVar114 = (float)((uint)(local_d8._0_1_ & 1) * local_118._56_4_ +
                                 (uint)!(bool)(local_d8._0_1_ & 1) * 0x3f7ff972);
                this_03 = (DenselySampledSpectrum *)(local_4f8.bits & 0xffffffffffff);
                sVar49 = (short)(local_4f8.bits >> 0x30);
                unique0x10009515 = puVar60;
                if (local_4f8.bits < (float **)0x3000000000000) {
                  if (sVar49 == 2) {
                    local_368.throughput = (SampledSpectrum *)&local_2d8;
                    local_368.pdfLight = &local_2e8;
                    local_368.pdfUni = &local_258;
                    local_368.rng = &local_4d8;
                    auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fStack_508 * fStack_508)),
                                              ZEXT416((uint)fStack_50c),ZEXT416((uint)fStack_50c));
                    auVar86 = vfmadd213ss_fma(ZEXT416((uint)fStack_504),ZEXT416((uint)fStack_504),
                                              auVar86);
                    if (auVar86._0_4_ < 0.0) {
                      fVar113 = sqrtf(auVar86._0_4_);
                      puVar60 = stack0xfffffffffffffaf0;
                    }
                    else {
                      auVar86 = vsqrtss_avx(auVar86,auVar86);
                      fVar113 = auVar86._0_4_;
                    }
                    fStack_50c = (float)((ulong)puVar60 >> 0x20);
                    auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fStack_508 * fStack_508)),
                                              ZEXT416((uint)fStack_50c),ZEXT416((uint)fStack_50c));
                    auVar86 = vfmadd213ss_fma(ZEXT416((uint)fStack_504),ZEXT416((uint)fStack_504),
                                              auVar86);
                    if (auVar86._0_4_ < 0.0) {
                      unique0x10009435 = puVar60;
                      fVar112 = sqrtf(auVar86._0_4_);
                      puVar60 = stack0xfffffffffffffaf0;
                    }
                    else {
                      auVar86 = vsqrtss_avx(auVar86,auVar86);
                      fVar112 = auVar86._0_4_;
                    }
                    fVar200 = fStack_504;
                    fVar156 = fStack_508;
                    fStack_50c = (float)((ulong)puVar60 >> 0x20);
                    fVar216 = fStack_50c;
                    local_518._8_4_ = SUB84(puVar60,0);
                    auVar117._4_4_ = local_518._0_4_;
                    auVar117._0_4_ = local_518._0_4_;
                    auVar117._8_4_ = local_518._0_4_;
                    auVar117._12_4_ = local_518._0_4_;
                    auVar158._4_4_ = local_518._4_4_;
                    auVar158._0_4_ = local_518._4_4_;
                    auVar158._8_4_ = local_518._4_4_;
                    auVar158._12_4_ = local_518._4_4_;
                    _local_4a0 = vmovlhps_avx(auVar117,auVar158);
                    auVar159._4_4_ = local_518._8_4_;
                    auVar159._0_4_ = local_518._8_4_;
                    auVar159._8_4_ = local_518._8_4_;
                    auVar159._12_4_ = local_518._8_4_;
                    local_490 = (Interval<float>)vmovlps_avx(auVar159);
                    auVar223 = ZEXT1664(auVar87);
                    auVar224 = ZEXT1664(auVar91);
                    unique0x1000944d = puVar60;
                    Transform::operator()
                              ((Point3fi *)local_418,(Transform *)(this_03 + 3),
                               (Point3fi *)local_4a0);
                    local_4e8._0_4_ = fVar113 * fVar114;
                    auVar118._0_4_ = fVar200 / fVar112;
                    auVar118._4_12_ = SUB6012((undefined1  [60])0x0,0);
                    fVar156 = fVar156 / fVar112;
                    auVar87 = ZEXT416((uint)(fVar216 / fVar112));
                    auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar156 * (float)this_03[3].lambda_max)
                                                     ),auVar87,ZEXT416((uint)this_03[3].lambda_min))
                    ;
                    _local_318 = vfmadd231ss_fma(auVar86,auVar118,
                                                 ZEXT416(*(uint *)&this_03[3].values.alloc.
                                                                   memoryResource));
                    auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar156 *
                                                            *(float *)((long)&this_03[3].values.ptr
                                                                      + 4))),auVar87,
                                              ZEXT416(*(uint *)&this_03[3].values.ptr));
                    local_458 = vfmadd231ss_fma(auVar86,auVar118,
                                                ZEXT416((uint)this_03[3].values.nAlloc));
                    auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar156 *
                                                            *(float *)((long)&this_03[3].values.
                                                                              nStored + 4))),auVar87
                                              ,ZEXT416((uint)this_03[3].values.nStored));
                    _local_348 = vfmadd231ss_fma(auVar86,auVar118,
                                                 ZEXT416((uint)this_03[4].lambda_min));
                    auVar86 = vfmadd231ss_fma(ZEXT416((uint)(local_458._0_4_ * local_458._0_4_)),
                                              _local_318,_local_318);
                    auVar86 = vfmadd231ss_fma(auVar86,_local_348,_local_348);
                    puVar60 = (undefined1 *)local_418._8_8_;
                    IVar116 = aIStack_408[0];
                    if (0.0 < auVar86._0_4_) {
                      auVar194._8_4_ = 0x7fffffff;
                      auVar194._0_8_ = 0x7fffffff7fffffff;
                      auVar194._12_4_ = 0x7fffffff;
                      auVar87 = vandps_avx(_local_318,auVar194);
                      auVar91 = vandps_avx(local_458,auVar194);
                      auVar160 = vandps_avx(_local_348,auVar194);
                      auVar87 = vfmadd231ss_fma(ZEXT416((uint)(auVar91._0_4_ * 0.0)),
                                                ZEXT816(0) << 0x40,auVar87);
                      auVar87 = vfmadd231ss_fma(auVar87,ZEXT816(0) << 0x40,auVar160);
                      fVar113 = auVar87._0_4_ / auVar86._0_4_;
                      fVar114 = local_318._0_4_ * fVar113;
                      i_00.high = fVar114;
                      i_00.low = fVar114;
                      auVar135._0_8_ =
                           Interval<float>::operator+<float>((Interval<float> *)local_418,i_00);
                      auVar135._8_56_ = extraout_var_08;
                      uVar157 = vmovlps_avx(auVar135._0_16_);
                      local_418._0_4_ = (undefined4)uVar157;
                      local_418._4_4_ = (undefined4)((ulong)uVar157 >> 0x20);
                      i_01.high = fVar113 * (float)local_458._0_4_;
                      i_01.low = fVar113 * (float)local_458._0_4_;
                      auVar136._0_8_ =
                           Interval<float>::operator+<float>
                                     ((Interval<float> *)(local_418 + 8),i_01);
                      auVar136._8_56_ = extraout_var_09;
                      uVar157 = vmovlps_avx(auVar136._0_16_);
                      local_418._8_4_ = (undefined4)uVar157;
                      local_418._12_4_ = (undefined4)((ulong)uVar157 >> 0x20);
                      i_02.high = fVar113 * (float)local_348._0_4_;
                      i_02.low = fVar113 * (float)local_348._0_4_;
                      auVar137._0_8_ = Interval<float>::operator+<float>(aIStack_408,i_02);
                      puVar60 = (undefined1 *)CONCAT44(local_418._12_4_,local_418._8_4_);
                      auVar137._8_56_ = extraout_var_10;
                      IVar116 = (Interval<float>)vmovlps_avx(auVar137._0_16_);
                      aIStack_408[0].low = SUB84(IVar116,0);
                      aIStack_408[0].high = (float)((ulong)IVar116 >> 0x20);
                      local_4e8._0_4_ = (float)local_4e8._0_4_ - fVar113;
                    }
                    aIStack_408[0].high = (float)((ulong)IVar116 >> 0x20);
                    aIStack_408[0].low = SUB84(IVar116,0);
                    local_418._12_4_ = (undefined4)((ulong)puVar60 >> 0x20);
                    local_418._8_4_ = SUB84(puVar60,0);
                    fVar114 = ((float)local_418._0_4_ + (float)local_418._4_4_) * 0.5;
                    fVar113 = ((float)local_418._8_4_ + (float)local_418._12_4_) * 0.5;
                    fVar112 = (aIStack_408[0].low + aIStack_408[0].high) * 0.5;
                    local_468._0_4_ = fVar112;
                    auVar86 = ZEXT816(0) << 0x40;
                    bVar84 = false;
                    uVar79 = 0;
                    do {
                      fVar216 = local_318._0_4_;
                      if ((uVar79 != 0) && (fVar216 = local_458._0_4_, uVar79 != 1)) {
                        fVar216 = local_348._0_4_;
                      }
                      pvVar80 = &this_03->values;
                      if ((uVar79 != 0) &&
                         (pvVar80 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                                    ((long)&(this_03->values).alloc.memoryResource + 4), uVar79 != 1
                         )) {
                        pvVar80 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                                  &(this_03->values).ptr;
                      }
                      fVar156 = fVar114;
                      if ((uVar79 != 0) && (fVar156 = fVar113, uVar79 != 1)) {
                        fVar156 = fVar112;
                      }
                      psVar81 = (size_t *)((long)&(this_03->values).ptr + 4);
                      if ((uVar79 != 0) && (psVar81 = &(this_03->values).nAlloc, uVar79 != 1)) {
                        psVar81 = (size_t *)((long)&(this_03->values).nAlloc + 4);
                      }
                      fVar200 = fVar114;
                      if ((uVar79 != 0) && (fVar200 = fVar113, uVar79 != 1)) {
                        fVar200 = fVar112;
                      }
                      auVar202 = ZEXT464(0x3f800000);
                      auVar91 = ZEXT416((uint)((1.0 / fVar216) * (*(float *)psVar81 - fVar200)));
                      auVar160 = ZEXT416((uint)((1.0 / fVar216) *
                                               (*(float *)&(pvVar80->alloc).memoryResource - fVar156
                                               )));
                      auVar87 = vminss_avx(auVar91,auVar160);
                      auVar86 = vmaxss_avx(auVar87,auVar86);
                      auVar87 = vmaxss_avx(auVar160,auVar91);
                      auVar87 = vminss_avx(ZEXT416((uint)(auVar87._0_4_ * 1.0000004)),
                                           ZEXT416((uint)local_4e8._0_4_));
                      auVar186 = ZEXT856(auVar87._8_8_);
                      local_4e8._0_4_ = auVar87._0_4_;
                      fVar216 = auVar86._0_4_;
                      if (auVar87._0_4_ < fVar216) break;
                      bVar84 = 1 < uVar79;
                      uVar79 = uVar79 + 1;
                    } while (uVar79 != 3);
                    local_418._8_8_ = puVar60;
                    aIStack_408[0] = IVar116;
                    puVar60 = unique0x10005421;
                    if (bVar84) {
                      fVar112 = *(float *)&this_03[2].values.nStored;
                      uStack_540 = 0;
                      SVar225 = DenselySampledSpectrum::Sample
                                          ((DenselySampledSpectrum *)&(this_03->values).nStored,
                                           lambda);
                      auVar172._0_8_ = SVar225.values.values._8_8_;
                      auVar172._8_56_ = auVar186;
                      local_548 = (undefined1  [8])SVar225.values.values._0_8_;
                      fVar156 = *(float *)&this_03[2].values.nStored;
                      auVar155 = (undefined1  [56])0x0;
                      SVar225 = DenselySampledSpectrum::Sample
                                          ((DenselySampledSpectrum *)&this_03[1].values.nStored,
                                           lambda);
                      auVar173._0_8_ = SVar225.values.values._8_8_;
                      auVar173._8_56_ = auVar186;
                      auVar138._0_8_ = SVar225.values.values._0_8_;
                      auVar138._8_56_ = auVar155;
                      auVar86 = vunpcklpd_avx(_local_548,auVar172._0_16_);
                      local_1e8._0_4_ = fVar112 * auVar86._0_4_;
                      local_1e8._4_4_ = fVar112 * auVar86._4_4_;
                      fStack_1e0 = fVar112 * auVar86._8_4_;
                      fStack_1dc = fVar112 * auVar86._12_4_;
                      auVar86 = vmovlhps_avx(auVar138._0_16_,auVar173._0_16_);
                      local_1f8._0_4_ = fVar156 * auVar86._0_4_;
                      local_1f8._4_4_ = fVar156 * auVar86._4_4_;
                      fStack_1f0 = fVar156 * auVar86._8_4_;
                      fStack_1ec = fVar156 * auVar86._12_4_;
                      local_248._0_4_ = (float)local_1f8._0_4_ + (float)local_1e8._0_4_;
                      local_248._4_4_ = (float)local_1f8._4_4_ + (float)local_1e8._4_4_;
                      local_248._8_4_ = fStack_1f0 + fStack_1e0;
                      local_248._12_4_ = fStack_1ec + fStack_1dc;
                      auVar222 = ZEXT1664(local_248);
                      fVar112 = *(float *)&(this_03->values).alloc.memoryResource;
                      fVar156 = *(float *)((long)&(this_03->values).alloc.memoryResource + 4);
                      fVar193 = *(float *)((long)&(this_03->values).ptr + 4) - fVar112;
                      fVar201 = *(float *)&(this_03->values).nAlloc - fVar156;
                      fVar200 = *(float *)&(this_03->values).ptr;
                      fVar203 = *(float *)((long)&(this_03->values).nAlloc + 4) - fVar200;
                      local_4a4 = (float)local_318._0_4_ / fVar193;
                      local_4b8 = (float)local_458._0_4_ / fVar201;
                      local_4a8 = (float)local_348._0_4_ / fVar203;
                      fVar112 = (fVar114 - fVar112) / fVar193 + fVar216 * local_4a4;
                      fVar156 = (fVar113 - fVar156) / fVar201 + fVar216 * local_4b8;
                      fVar200 = ((float)local_468._0_4_ - fVar200) / fVar203 + fVar216 * local_4a8;
                      pvVar80 = &this_03[10].values;
                      fVar193 = 1.0 / (float)*(int *)&this_03[10].values.alloc.memoryResource;
                      pvVar2 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                               ((long)&this_03[10].values.alloc.memoryResource + 4);
                      fVar201 = 1.0 / (float)*(int *)((long)&this_03[10].values.alloc.memoryResource
                                                     + 4);
                      auVar202 = ZEXT1664(ZEXT416((uint)fVar201));
                      ppfVar3 = &this_03[10].values.ptr;
                      fVar203 = 1.0 / (float)*(int *)&this_03[10].values.ptr;
                      lVar73 = 0;
                      do {
                        iVar85 = (int)lVar73;
                        pfVar83 = &local_4a4;
                        if ((iVar85 != 0) && (pfVar83 = &local_4a8, iVar85 == 1)) {
                          pfVar83 = &local_4b8;
                        }
                        if ((*pfVar83 == 0.0) && (!NAN(*pfVar83))) {
                          pfVar83 = &local_4a4;
                          if ((iVar85 != 0) && (pfVar83 = &local_4a8, iVar85 == 1)) {
                            pfVar83 = &local_4b8;
                          }
                          *pfVar83 = 0.0;
                        }
                        fVar207 = fVar112;
                        if ((iVar85 != 0) && (fVar207 = fVar156, iVar85 != 1)) {
                          fVar207 = fVar200;
                        }
                        pvVar76 = pvVar80;
                        if ((iVar85 != 0) && (pvVar76 = pvVar2, iVar85 != 1)) {
                          pvVar76 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                                    ppfVar3;
                        }
                        pvVar78 = pvVar80;
                        if ((iVar85 != 0) && (pvVar78 = pvVar2, iVar85 != 1)) {
                          pvVar78 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                                    ppfVar3;
                        }
                        auVar212._0_4_ = (float)(*(int *)&(pvVar78->alloc).memoryResource + -1);
                        auVar212._4_12_ = auVar223._4_12_;
                        auVar87 = ZEXT416((uint)(fVar207 *
                                                (float)*(int *)&(pvVar76->alloc).memoryResource));
                        auVar86 = vminss_avx(auVar212,auVar87);
                        uVar157 = vcmpss_avx512f(auVar87,ZEXT816(0) << 0x40,1);
                        auVar93._16_48_ = in_ZmmResult._16_48_;
                        auVar93._0_16_ = auVar86;
                        fVar207 = (float)((uint)!(bool)((byte)uVar157 & 1) * auVar86._0_4_);
                        in_ZmmResult._4_60_ = auVar93._4_60_;
                        in_ZmmResult._0_4_ = (int)fVar207;
                        iVar74 = (int)fVar207;
                        local_4b4[lVar73] = iVar74;
                        pfVar83 = &local_4a4;
                        if ((iVar85 != 0) && (pfVar83 = &local_4a8, iVar85 == 1)) {
                          pfVar83 = &local_4b8;
                        }
                        if (0.0 <= *pfVar83) {
                          pvVar76 = pvVar80;
                          if ((iVar85 != 0) && (pvVar76 = pvVar2, iVar85 != 1)) {
                            pvVar76 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                                      ppfVar3;
                          }
                          fVar207 = fVar112;
                          if ((iVar85 != 0) && (fVar207 = fVar156, iVar85 != 1)) {
                            fVar207 = fVar200;
                          }
                          pfVar83 = &local_4a4;
                          if ((iVar85 != 0) && (pfVar83 = &local_4a8, iVar85 == 1)) {
                            pfVar83 = &local_4b8;
                          }
                          *(float *)(local_4a0 + lVar73 * 4) =
                               fVar216 + ((float)(iVar74 + 1) /
                                          (float)*(int *)&(pvVar76->alloc).memoryResource - fVar207)
                                         / *pfVar83;
                          fVar207 = fVar193;
                          if ((iVar85 != 0) && (fVar207 = fVar201, iVar85 != 1)) {
                            fVar207 = fVar203;
                          }
                          pfVar83 = &local_4a4;
                          if ((iVar85 != 0) && (pfVar83 = &local_4a8, iVar85 == 1)) {
                            pfVar83 = &local_4b8;
                          }
                          afStack_324[lVar73] = fVar207 / *pfVar83;
                          aiStack_330[lVar73] = 1;
                          pvVar76 = pvVar80;
                          if ((iVar85 != 0) && (pvVar76 = pvVar2, iVar85 != 1)) {
                            pvVar76 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                                      ppfVar3;
                          }
                          iVar85 = *(int *)&(pvVar76->alloc).memoryResource;
                        }
                        else {
                          pvVar76 = pvVar80;
                          if ((iVar85 != 0) && (pvVar76 = pvVar2, iVar85 != 1)) {
                            pvVar76 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                                      ppfVar3;
                          }
                          fVar207 = fVar112;
                          if ((iVar85 != 0) && (fVar207 = fVar156, iVar85 != 1)) {
                            fVar207 = fVar200;
                          }
                          pfVar83 = &local_4a4;
                          if ((iVar85 != 0) && (pfVar83 = &local_4a8, iVar85 == 1)) {
                            pfVar83 = &local_4b8;
                          }
                          *(float *)(local_4a0 + lVar73 * 4) =
                               fVar216 + ((float)iVar74 /
                                          (float)*(int *)&(pvVar76->alloc).memoryResource - fVar207)
                                         / *pfVar83;
                          auVar86 = ZEXT416((uint)fVar193);
                          if ((iVar85 != 0) && (auVar86 = ZEXT416((uint)fVar201), iVar85 != 1)) {
                            auVar86 = ZEXT416((uint)fVar203);
                          }
                          pfVar83 = &local_4a4;
                          if ((iVar85 != 0) && (pfVar83 = &local_4a8, iVar85 == 1)) {
                            pfVar83 = &local_4b8;
                          }
                          auVar10._8_4_ = 0x80000000;
                          auVar10._0_8_ = 0x8000000080000000;
                          auVar10._12_4_ = 0x80000000;
                          in_ZmmResult._0_16_ = vxorps_avx512vl(auVar86,auVar10);
                          in_ZmmResult._16_48_ = auVar93._16_48_;
                          afStack_324[lVar73] = in_ZmmResult._0_4_ / *pfVar83;
                          aiStack_330[lVar73] = -1;
                          iVar85 = -1;
                        }
                        aiStack_274[lVar73] = iVar85;
                        lVar73 = lVar73 + 1;
                      } while (lVar73 != 3);
                      uVar79 = (uint)(local_4d8.state >> 0x2d) ^ (uint)(local_4d8.state >> 0x1b);
                      bVar72 = (byte)(local_4d8.state >> 0x3b);
                      auVar86 = vcvtusi2ss_avx512f(auVar223._0_16_,
                                                   uVar79 >> bVar72 | uVar79 << 0x20 - bVar72);
                      auVar86 = vminss_avx(ZEXT416((uint)(auVar86._0_4_ * 2.3283064e-10)),
                                           ZEXT416(0x3f7fffff));
                      local_568 = ZEXT416(auVar86._0_4_);
                      local_4d8.state = local_4d8.state * 0x5851f42d4c957f2d + local_4d8.inc;
                      puVar60 = stack0xfffffffffffffaf0;
                      do {
                        lVar73 = (long)*(int *)(&DAT_005e6660 +
                                               (ulong)((uint)((float)local_4a0._4_4_ <
                                                             IStack_498.low) |
                                                      (uint)((float)local_4a0._0_4_ <
                                                            (float)local_4a0._4_4_) * 4 +
                                                      (uint)((float)local_4a0._0_4_ < IStack_498.low
                                                            ) * 2) * 4);
                        fVar112 = *(float *)(local_4a0 + lVar73 * 4);
                        uVar4 = *(undefined4 *)
                                 (this_03[9].values.nAlloc +
                                 (((long)local_4b4[2] *
                                   (long)*(int *)((long)&this_03[10].values.alloc.memoryResource + 4
                                                 ) + (long)local_4b4[1]) *
                                  (long)*(int *)&this_03[10].values.alloc.memoryResource +
                                 (long)local_4b4[0]) * 4);
                        auVar11._4_4_ = uVar4;
                        auVar11._0_4_ = uVar4;
                        auVar11._8_4_ = uVar4;
                        auVar11._12_4_ = uVar4;
                        auVar94._16_48_ = in_ZmmResult._16_48_;
                        auVar94._0_16_ = vmulps_avx512vl(auVar222._0_16_,auVar11);
                        in_ZmmResult = auVar94;
                        if (auVar94._0_4_ <= 0.0) {
LAB_0041a343:
                          fVar156 = *(float *)(local_4a0 + lVar73 * 4);
                          if (((float)local_4e8._0_4_ < fVar156) ||
                             (iVar85 = local_4b4[lVar73],
                             local_4b4[lVar73] = iVar85 + aiStack_330[lVar73],
                             iVar85 + aiStack_330[lVar73] == aiStack_274[lVar73])) {
                            bVar84 = false;
                          }
                          else {
                            *(float *)(local_4a0 + lVar73 * 4) = fVar156 + afStack_324[lVar73];
                            bVar84 = true;
                            fVar216 = fVar112;
                          }
                        }
                        else {
                          auVar12._8_4_ = 0x80000000;
                          auVar12._0_8_ = 0x8000000080000000;
                          auVar12._12_4_ = 0x80000000;
                          auVar95._0_16_ = vxorps_avx512vl(auVar94._0_16_,auVar12);
                          auVar95._16_48_ = auVar94._16_48_;
                          in_ZmmResult = auVar95;
                          do {
                            local_548._0_4_ = auVar95._0_4_;
                            unique0x1000949d = puVar60;
                            fVar156 = expf((fVar112 - fVar216) * (float)local_548._0_4_);
                            fVar156 = 1.0 - fVar156;
                            if (fVar156 <= (float)local_568._0_4_) {
                              auVar86 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                                                   ZEXT416((uint)(((float)local_568._0_4_ - fVar156)
                                                                 / (1.0 - fVar156))));
                              local_568._0_4_ = auVar86._0_4_;
                              iVar85 = 8;
                              puVar60 = stack0xfffffffffffffaf0;
                            }
                            else {
                              fVar156 = logf(1.0 - (float)local_568._0_4_);
                              fVar156 = fVar216 - fVar156 / auVar94._0_4_;
                              auVar202 = ZEXT464((uint)fVar156);
                              if ((float)local_4e8._0_4_ <= fVar156) {
                                local_380 = false;
                                local_378.values.values[2] = 1.0;
                                local_378.values.values[0] = 1.0;
                                local_378.values.values[1] = 1.0;
                                local_378.values.values[3] = 1.0;
                                SampleLd::anon_class_32_4_b07b4888::operator()
                                          (&local_368,(MediumSample *)local_418);
                                if (local_380 == true) {
                                  local_380 = false;
                                }
                                iVar85 = 1;
                                puVar60 = stack0xfffffffffffffaf0;
                              }
                              else {
                                auVar86 = vinsertps_avx(ZEXT416((uint)(fVar156 * (float)local_318.
                                                                                        _0_4_ +
                                                                      fVar114)),
                                                        ZEXT416((uint)(fVar156 * (float)local_458.
                                                                                        _0_4_ +
                                                                      fVar113)),0x10);
                                local_4c8.z = fVar156 * (float)local_348._0_4_ +
                                              (float)local_468._0_4_;
                                local_4c8._0_8_ = vmovlps_avx(auVar86);
                                local_2b8._0_4_ = fVar156;
                                fVar156 = fVar156 - fVar216;
                                local_548._4_4_ = auVar95._4_4_;
                                uStack_540._0_4_ = auVar95._8_4_;
                                uStack_540._4_4_ = auVar95._12_4_;
                                auVar119._0_4_ = fVar156 * (float)local_548._0_4_;
                                auVar119._4_4_ = fVar156 * (float)local_548._4_4_;
                                auVar119._8_4_ = fVar156 * (float)uStack_540;
                                auVar119._12_4_ = fVar156 * uStack_540._4_4_;
                                auVar13._8_4_ = 0x3fb8aa3b;
                                auVar13._0_8_ = 0x3fb8aa3b3fb8aa3b;
                                auVar13._12_4_ = 0x3fb8aa3b;
                                auVar111 = in_ZmmResult._16_48_;
                                auVar86 = vmulps_avx512vl(auVar119,auVar13);
                                _local_2f8 = vroundps_avx(auVar86,9);
                                auVar86 = vsubps_avx(auVar86,_local_2f8);
                                auVar186 = ZEXT856(auVar86._8_8_);
                                auVar161._8_4_ = 0x3da1d5b6;
                                auVar161._0_8_ = 0x3da1d5b63da1d5b6;
                                auVar161._12_4_ = 0x3da1d5b6;
                                auVar14._8_4_ = 0x3e658299;
                                auVar14._0_8_ = 0x3e6582993e658299;
                                auVar14._12_4_ = 0x3e658299;
                                auVar87 = vfmadd213ps_avx512vl(auVar161,auVar86,auVar14);
                                auVar15._8_4_ = 0x3f3263b7;
                                auVar15._0_8_ = 0x3f3263b73f3263b7;
                                auVar15._12_4_ = 0x3f3263b7;
                                auVar87 = vfmadd213ps_avx512vl(auVar87,auVar86,auVar15);
                                auVar16._8_4_ = 0x3f7ff3bf;
                                auVar16._0_8_ = 0x3f7ff3bf3f7ff3bf;
                                auVar16._12_4_ = 0x3f7ff3bf;
                                local_438 = vfmadd213ps_avx512vl(auVar87,auVar86,auVar16);
                                auVar155 = ZEXT856(local_438._8_8_);
                                SVar225 = UniformGridMediumProvider::Density
                                                    (*(UniformGridMediumProvider **)this_03,
                                                     (Point3f *)&local_4c8,lambda);
                                auVar174._0_8_ = SVar225.values.values._8_8_;
                                auVar174._8_56_ = auVar155;
                                auVar139._0_8_ = SVar225.values.values._0_8_;
                                auVar139._8_56_ = auVar186;
                                local_448 = auVar139._0_16_;
                                local_308 = auVar174._0_16_;
                                SVar225 = UniformGridMediumProvider::Le
                                                    (*(UniformGridMediumProvider **)this_03,
                                                     (Point3f *)&local_4c8,lambda);
                                auVar175._0_8_ = SVar225.values.values._8_8_;
                                auVar175._8_56_ = auVar155;
                                auVar140._0_8_ = SVar225.values.values._0_8_;
                                auVar140._8_56_ = auVar186;
                                auVar86 = vfmadd231ss_fma(ZEXT416((uint)(local_4c8.y *
                                                                        *(float *)((long)&this_03[6]
                                                                                          .values.
                                                  alloc.memoryResource + 4))),
                                                  ZEXT416((uint)local_4c8.x),
                                                  ZEXT416(*(uint *)&this_03[6].values.alloc.
                                                                    memoryResource));
                                auVar86 = vfmadd231ss_fma(auVar86,ZEXT416((uint)local_4c8.z),
                                                          ZEXT416(*(uint *)&this_03[6].values.ptr));
                                fVar156 = auVar86._0_4_ +
                                          *(float *)((long)&this_03[6].values.ptr + 4);
                                auVar86 = vfmadd231ss_fma(ZEXT416((uint)(local_4c8.y *
                                                                        *(float *)((long)&this_03[6]
                                                                                          .values.
                                                  nAlloc + 4))),ZEXT416((uint)local_4c8.x),
                                                  ZEXT416((uint)this_03[6].values.nAlloc));
                                auVar86 = vfmadd231ss_fma(auVar86,ZEXT416((uint)local_4c8.z),
                                                          ZEXT416((uint)this_03[6].values.nStored));
                                fVar200 = auVar86._0_4_ +
                                          *(float *)((long)&this_03[6].values.nStored + 4);
                                auVar86 = vfmadd231ss_fma(ZEXT416((uint)(local_4c8.y *
                                                                        (float)this_03[7].lambda_max
                                                                        )),
                                                          ZEXT416((uint)local_4c8.x),
                                                          ZEXT416((uint)this_03[7].lambda_min));
                                auVar86 = vfmadd231ss_fma(auVar86,ZEXT416((uint)local_4c8.z),
                                                          ZEXT416(*(uint *)&this_03[7].values.alloc.
                                                                            memoryResource));
                                fVar193 = auVar86._0_4_ +
                                          *(float *)((long)&this_03[7].values.alloc.memoryResource +
                                                    4);
                                auVar86 = vfmadd231ss_fma(ZEXT416((uint)(local_4c8.y *
                                                                        *(float *)((long)&this_03[7]
                                                                                          .values.
                                                  ptr + 4))),ZEXT416((uint)local_4c8.x),
                                                  ZEXT416(*(uint *)&this_03[7].values.ptr));
                                auVar86 = vfmadd231ss_fma(auVar86,ZEXT416((uint)local_4c8.z),
                                                          ZEXT416((uint)this_03[7].values.nAlloc));
                                fVar201 = auVar86._0_4_ +
                                          *(float *)((long)&this_03[7].values.nAlloc + 4);
                                bVar84 = fVar201 == 1.0;
                                auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fStack_508 * fStack_508)),
                                                          ZEXT416((uint)fStack_50c),
                                                          ZEXT416((uint)fStack_50c));
                                auVar86 = vfmadd213ss_fma(ZEXT416((uint)fStack_504),
                                                          ZEXT416((uint)fStack_504),auVar86);
                                if (auVar86._0_4_ < 0.0) {
                                  local_228 = ZEXT416((uint)fVar156);
                                  local_238 = ZEXT416((uint)fVar200);
                                  local_268 = ZEXT416((uint)fVar193);
                                  local_46c = fVar201;
                                  local_218 = auVar175._0_16_;
                                  local_208 = auVar140._0_16_;
                                  fVar203 = sqrtf(auVar86._0_4_);
                                  fVar201 = local_46c;
                                  auVar87 = local_228;
                                  auVar91 = local_268;
                                  auVar86 = local_208;
                                  fVar200 = (float)local_238._0_4_;
                                  auVar160 = local_218;
                                  puVar60 = stack0xfffffffffffffaf0;
                                }
                                else {
                                  auVar86 = vsqrtss_avx(auVar86,auVar86);
                                  fVar203 = auVar86._0_4_;
                                  auVar87 = ZEXT416((uint)fVar156);
                                  auVar91 = ZEXT416((uint)fVar193);
                                  auVar86 = auVar140._0_16_;
                                  auVar160 = auVar175._0_16_;
                                  puVar60 = stack0xfffffffffffffaf0;
                                }
                                TVar68.bits = local_4f8.bits;
                                fStack_50c = (float)((ulong)puVar60 >> 0x20);
                                auVar224 = ZEXT1664(auVar86);
                                auVar187._0_4_ = (int)(float)local_2f8._0_4_;
                                auVar187._4_4_ = (int)(float)local_2f8._4_4_;
                                auVar187._8_4_ = (int)fStack_2f0;
                                auVar187._12_4_ = (int)fStack_2ec;
                                auVar17._8_4_ = 0xffffffe1;
                                auVar17._0_8_ = 0xffffffe1ffffffe1;
                                auVar17._12_4_ = 0xffffffe1;
                                uVar75 = vpcmpgtd_avx512vl(auVar187,auVar17);
                                uVar75 = uVar75 & 0xf;
                                auVar18._8_4_ = 0x1e;
                                auVar18._0_8_ = 0x1e0000001e;
                                auVar18._12_4_ = 0x1e;
                                uVar77 = vpcmpgtd_avx512vl(auVar187,auVar18);
                                uVar77 = uVar77 & 0xf;
                                auVar188 = vpslld_avx(auVar187,0x17);
                                auVar188 = vpaddd_avx(auVar188,local_438);
                                auVar88 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                bVar9 = (bool)((byte)uVar77 & 1);
                                auVar89._0_4_ =
                                     (uint)bVar9 * auVar88._0_4_ |
                                     (uint)!bVar9 * (uint)((byte)uVar75 & 1) * auVar188._0_4_;
                                bVar9 = (bool)((byte)(uVar77 >> 1) & 1);
                                auVar89._4_4_ =
                                     (uint)bVar9 * auVar88._4_4_ |
                                     (uint)!bVar9 * (uint)((byte)(uVar75 >> 1) & 1) * auVar188._4_4_
                                ;
                                bVar9 = (bool)((byte)(uVar77 >> 2) & 1);
                                auVar89._8_4_ =
                                     (uint)bVar9 * auVar88._8_4_ |
                                     (uint)!bVar9 * (uint)((byte)(uVar75 >> 2) & 1) * auVar188._8_4_
                                ;
                                bVar9 = SUB81(uVar77 >> 3,0);
                                auVar89._12_4_ =
                                     (uint)bVar9 * auVar88._12_4_ |
                                     (uint)!bVar9 * (uint)(byte)(uVar75 >> 3) * auVar188._12_4_;
                                auVar88 = vshufpd_avx(auVar89,auVar89,1);
                                auVar188 = vmovlhps_avx(local_448,local_308);
                                fVar156 = auVar87._0_4_ / fVar201;
                                auVar97._4_12_ = auVar87._4_12_;
                                auVar97._0_4_ = fVar156;
                                fVar193 = auVar91._0_4_ / fVar201;
                                auVar98._4_12_ = auVar91._4_12_;
                                auVar98._0_4_ = fVar193;
                                auVar97._16_48_ = auVar111;
                                auVar96._4_60_ = auVar97._4_60_;
                                auVar96._0_4_ =
                                     (uint)bVar84 * (int)auVar87._0_4_ +
                                     (uint)!bVar84 * (int)fVar156;
                                iVar85 = (uint)bVar84 * (int)fVar200 +
                                         (uint)!bVar84 * (int)(fVar200 / fVar201);
                                auVar98._16_48_ = auVar111;
                                in_ZmmResult._4_60_ = auVar98._4_60_;
                                in_ZmmResult._0_4_ =
                                     (uint)bVar84 * (int)auVar91._0_4_ +
                                     (uint)!bVar84 * (int)fVar193;
                                aIStack_408[9].low = auVar188._0_4_ * (float)local_1e8._0_4_;
                                aIStack_408[9].high = auVar188._4_4_ * (float)local_1e8._4_4_;
                                aIStack_408[10].low = auVar188._8_4_ * fStack_1e0;
                                aIStack_408[10].high = auVar188._12_4_ * fStack_1dc;
                                aIStack_408[0xb].low = auVar188._0_4_ * (float)local_1f8._0_4_;
                                aIStack_408[0xb].high = auVar188._4_4_ * (float)local_1f8._4_4_;
                                aIStack_408[0xc].low = auVar188._8_4_ * fStack_1f0;
                                aIStack_408[0xc].high = auVar188._12_4_ * fStack_1ec;
                                auVar223 = ZEXT1664(CONCAT412(0x80000000,
                                                              CONCAT48(0x80000000,0x8000000080000000
                                                                      )));
                                aIStack_408[2].high = -fStack_504 / fVar203;
                                auVar219._0_8_ =
                                     CONCAT44(fStack_508,fStack_50c) ^ 0x8000000080000000;
                                auVar219._8_4_ = 0x80000000;
                                auVar219._12_4_ = 0x80000000;
                                auVar120._4_4_ = fVar203;
                                auVar120._0_4_ = fVar203;
                                auVar120._8_4_ = fVar203;
                                auVar120._12_4_ = fVar203;
                                auVar87 = vdivps_avx(auVar219,auVar120);
                                auVar204._4_4_ = iVar85;
                                auVar204._0_4_ = iVar85;
                                auVar204._8_4_ = iVar85;
                                auVar204._12_4_ = iVar85;
                                auVar208._4_4_ = in_ZmmResult._0_4_;
                                auVar208._0_4_ = in_ZmmResult._0_4_;
                                auVar208._8_4_ = in_ZmmResult._0_4_;
                                auVar208._12_4_ = in_ZmmResult._0_4_;
                                aIStack_408._24_16_ =
                                     ZEXT416((uint)(auVar219._0_8_ >> 0x20) ^ (uint)-fStack_508) <<
                                     0x20;
                                aIStack_408[5].low = 0.0;
                                local_380 = true;
                                auVar91 = vshufps_avx(auVar96._0_16_,auVar204,0x40);
                                auVar202 = ZEXT1664(auVar91);
                                local_418._0_4_ = auVar91._0_4_;
                                local_418._4_4_ = auVar91._4_4_;
                                local_418._8_4_ = auVar91._8_4_;
                                local_418._12_4_ = auVar91._12_4_;
                                uVar157 = vmovlps_avx(auVar208);
                                aIStack_408[0].low = (float)uVar157;
                                aIStack_408[0].high = (float)((ulong)uVar157 >> 0x20);
                                aIStack_408[1].low = fStack_500;
                                uVar157 = vmovlps_avx(auVar87);
                                aIStack_408[1].high = (float)uVar157;
                                aIStack_408[2].low = (float)((ulong)uVar157 >> 0x20);
                                aIStack_408[6].low = 0.0;
                                aIStack_408[6].high = 0.0;
                                local_4f8.bits._0_4_ = (undefined4)TVar67.bits;
                                local_4f8.bits._4_4_ = SUB84(TVar67.bits,4);
                                aIStack_408[7].low = (float)(undefined4)local_4f8.bits;
                                aIStack_408[7].high = (float)local_4f8.bits._4_4_;
                                aIStack_408._120_16_ = vmovlhps_avx(auVar86,auVar160);
                                local_378.values.values =
                                     (array<float,_4>)vunpcklpd_avx(auVar89,auVar88);
                                local_4f8.bits = TVar68.bits;
                                aIStack_408[8] =
                                     (Interval<float>)
                                     ((ulong)((long)&this_03[2].values.nStored + 4U) |
                                     0x1000000000000);
                                aIStack_408._104_16_ = auVar94._0_16_;
                                unique0x10009505 = puVar60;
                                bVar84 = SampleLd::anon_class_32_4_b07b4888::operator()
                                                   (&local_368,(MediumSample *)local_418);
                                aVar64._4_4_ = local_418._4_4_;
                                aVar64._0_4_ = local_418._0_4_;
                                if (local_380 == true) {
                                  local_380 = false;
                                }
                                iVar85 = 1;
                                local_418._8_8_ =
                                     (undefined1 *)CONCAT44(local_418._12_4_,local_418._8_4_);
                                aIStack_408[0] =
                                     (Interval<float>)
                                     CONCAT44(aIStack_408[0].high,aIStack_408[0].low);
                                aIStack_408[1] =
                                     (Interval<float>)
                                     CONCAT44(aIStack_408[1].high,aIStack_408[1].low);
                                puVar60 = stack0xfffffffffffffaf0;
                                if (bVar84) {
                                  uVar79 = (uint)(local_4d8.state >> 0x2d) ^
                                           (uint)(local_4d8.state >> 0x1b);
                                  bVar72 = (byte)(local_4d8.state >> 0x3b);
                                  auVar86 = vcvtusi2ss_avx512f(in_XMM15,uVar79 >> bVar72 |
                                                                        uVar79 << 0x20 - bVar72);
                                  auVar86 = vminss_avx(ZEXT416((uint)(auVar86._0_4_ * 2.3283064e-10)
                                                              ),ZEXT416(0x3f7fffff));
                                  local_568._0_4_ = auVar86._0_4_;
                                  iVar85 = 0;
                                  local_4d8.state =
                                       local_4d8.state * 0x5851f42d4c957f2d + local_4d8.inc;
                                  fVar216 = (float)local_2b8._0_4_;
                                  local_418._0_8_ = aVar64;
                                  local_418._8_8_ =
                                       (undefined1 *)CONCAT44(local_418._12_4_,local_418._8_4_);
                                  aIStack_408[0] =
                                       (Interval<float>)
                                       CONCAT44(aIStack_408[0].high,aIStack_408[0].low);
                                  aIStack_408[1] =
                                       (Interval<float>)
                                       CONCAT44(aIStack_408[1].high,aIStack_408[1].low);
                                }
                              }
                            }
                          } while (iVar85 == 0);
                          if (iVar85 == 8) {
                            auVar222 = ZEXT1664(local_248);
                            goto LAB_0041a343;
                          }
                          bVar84 = false;
                          auVar222 = ZEXT1664(local_248);
                        }
                        pVVar82 = local_420;
                      } while (bVar84);
                    }
                  }
                  else {
                    local_368.throughput = (SampledSpectrum *)&local_2d8;
                    local_368.pdfLight = &local_2e8;
                    local_368.pdfUni = &local_258;
                    local_368.rng = &local_4d8;
                    auVar160 = vfmadd231ss_fma(ZEXT416((uint)(fStack_508 * fStack_508)),
                                               ZEXT416((uint)fStack_50c),ZEXT416((uint)fStack_50c));
                    auVar160 = vfmadd213ss_fma(ZEXT416((uint)fStack_504),ZEXT416((uint)fStack_504),
                                               auVar160);
                    if (auVar160._0_4_ < 0.0) {
                      fVar113 = sqrtf(auVar160._0_4_);
                      puVar60 = stack0xfffffffffffffaf0;
                    }
                    else {
                      auVar160 = vsqrtss_avx(auVar160,auVar160);
                      fVar113 = auVar160._0_4_;
                    }
                    fStack_50c = (float)((ulong)puVar60 >> 0x20);
                    auVar160 = vfmadd231ss_fma(ZEXT416((uint)(fStack_508 * fStack_508)),
                                               ZEXT416((uint)fStack_50c),ZEXT416((uint)fStack_50c));
                    uVar75 = auVar160._8_8_;
                    auVar160 = vfmadd213ss_fma(ZEXT416((uint)fStack_504),ZEXT416((uint)fStack_504),
                                               auVar160);
                    if (auVar160._0_4_ < 0.0) {
                      unique0x1000937d = puVar60;
                      auVar146._0_4_ = sqrtf(auVar160._0_4_);
                      auVar146._4_60_ = extraout_var_00;
                      local_448 = auVar146._0_16_;
                      puVar60 = stack0xfffffffffffffaf0;
                    }
                    else {
                      local_448 = vsqrtss_avx(auVar160,auVar160);
                    }
                    fVar216 = fStack_504;
                    fStack_50c = (float)((ulong)puVar60 >> 0x20);
                    local_518._8_4_ = SUB84(puVar60,0);
                    local_308._4_4_ = fStack_508;
                    local_308._0_4_ = fStack_50c;
                    local_308._8_8_ = 0;
                    uVar4 = local_518._0_4_;
                    local_438._0_4_ = local_518._4_4_;
                    local_2f8._0_4_ = local_518._8_4_;
                    fVar112 = (float)this_03[3].lambda_min;
                    uStack_540 = 0;
                    auVar155 = ZEXT856(uVar75);
                    auVar202 = ZEXT1664(auVar86);
                    auVar223 = ZEXT1664(auVar87);
                    auVar224 = ZEXT1664(auVar91);
                    unique0x100093dd = puVar60;
                    SVar225 = DenselySampledSpectrum::Sample(this_03,lambda);
                    auVar179._0_8_ = SVar225.values.values._8_8_;
                    auVar179._8_56_ = auVar155;
                    local_548 = (undefined1  [8])SVar225.values.values._0_8_;
                    auVar186 = (undefined1  [56])0x0;
                    local_4e8 = ZEXT416((uint)this_03[3].lambda_min);
                    SVar225 = DenselySampledSpectrum::Sample(this_03 + 1,lambda);
                    auVar111 = in_ZmmResult._16_48_;
                    auVar180._0_8_ = SVar225.values.values._8_8_;
                    auVar180._8_56_ = auVar155;
                    auVar147._0_8_ = SVar225.values.values._0_8_;
                    auVar147._8_56_ = auVar186;
                    auVar86 = vunpcklpd_avx(_local_548,auVar179._0_16_);
                    auVar196._0_4_ = fVar112 * auVar86._0_4_;
                    auVar196._4_4_ = fVar112 * auVar86._4_4_;
                    auVar196._8_4_ = fVar112 * auVar86._8_4_;
                    auVar196._12_4_ = fVar112 * auVar86._12_4_;
                    auVar86 = vmovlhps_avx(auVar147._0_16_,auVar180._0_16_);
                    local_528._0_4_ = (float)local_4e8._0_4_ * auVar86._0_4_;
                    local_528._4_4_ = (float)local_4e8._0_4_ * auVar86._4_4_;
                    fStack_520 = (float)local_4e8._0_4_ * auVar86._8_4_;
                    fStack_51c = (float)local_4e8._0_4_ * auVar86._12_4_;
                    auVar190._0_4_ = (float)local_528._0_4_ + auVar196._0_4_;
                    auVar190._4_4_ = (float)local_528._4_4_ + auVar196._4_4_;
                    auVar190._8_4_ = fStack_520 + auVar196._8_4_;
                    auVar190._12_4_ = fStack_51c + auVar196._12_4_;
                    if ((auVar190._0_4_ != 0.0) ||
                       (puVar60 = stack0xfffffffffffffaf0, NAN(auVar190._0_4_))) {
                      fVar113 = fVar113 * fVar114;
                      uVar79 = (uint)(local_4d8.state >> 0x2d) ^ (uint)(local_4d8.state >> 0x1b);
                      bVar72 = (byte)(local_4d8.state >> 0x3b);
                      auVar86 = vcvtusi2ss_avx512f(auVar202._0_16_,
                                                   uVar79 >> bVar72 | uVar79 << 0x20 - bVar72);
                      auVar86 = vminss_avx(ZEXT416((uint)(auVar86._0_4_ * 2.3283064e-10)),
                                           ZEXT416(0x3f7fffff));
                      local_4d8.state = local_4d8.state * 0x5851f42d4c957f2d + local_4d8.inc;
                      fVar114 = logf(1.0 - auVar86._0_4_);
                      fVar114 = -fVar114 / auVar190._0_4_;
                      if (fVar113 <= fVar114) {
                        auVar129._0_4_ = auVar190._0_4_ * -fVar113;
                        auVar129._4_4_ = auVar190._4_4_ * -fVar113;
                        auVar129._8_4_ = auVar190._8_4_ * -fVar113;
                        auVar129._12_4_ = auVar190._12_4_ * -fVar113;
                        auVar25._8_4_ = 0x3fb8aa3b;
                        auVar25._0_8_ = 0x3fb8aa3b3fb8aa3b;
                        auVar25._12_4_ = 0x3fb8aa3b;
                        auVar87 = vmulps_avx512vl(auVar129,auVar25);
                        auVar86 = vroundps_avx(auVar87,9);
                        auVar87 = vsubps_avx(auVar87,auVar86);
                        auVar169._0_4_ = (int)auVar86._0_4_;
                        auVar169._4_4_ = (int)auVar86._4_4_;
                        auVar169._8_4_ = (int)auVar86._8_4_;
                        auVar169._12_4_ = (int)auVar86._12_4_;
                        auVar26._8_4_ = 0xffffffe1;
                        auVar26._0_8_ = 0xffffffe1ffffffe1;
                        auVar26._12_4_ = 0xffffffe1;
                        uVar75 = vpcmpgtd_avx512vl(auVar169,auVar26);
                        uVar75 = uVar75 & 0xf;
                        auVar27._8_4_ = 0x1e;
                        auVar27._0_8_ = 0x1e0000001e;
                        auVar27._12_4_ = 0x1e;
                        uVar77 = vpcmpgtd_avx512vl(auVar169,auVar27);
                        uVar77 = uVar77 & 0xf;
                        auVar192._8_4_ = 0x3da1d5b6;
                        auVar192._0_8_ = 0x3da1d5b63da1d5b6;
                        auVar192._12_4_ = 0x3da1d5b6;
                        auVar28._8_4_ = 0x3e658299;
                        auVar28._0_8_ = 0x3e6582993e658299;
                        auVar28._12_4_ = 0x3e658299;
                        auVar86 = vfmadd213ps_avx512vl(auVar192,auVar87,auVar28);
                        auVar29._8_4_ = 0x3f3263b7;
                        auVar29._0_8_ = 0x3f3263b73f3263b7;
                        auVar29._12_4_ = 0x3f3263b7;
                        auVar86 = vfmadd213ps_avx512vl(auVar86,auVar87,auVar29);
                        auVar30._8_4_ = 0x3f7ff3bf;
                        auVar30._0_8_ = 0x3f7ff3bf3f7ff3bf;
                        auVar30._12_4_ = 0x3f7ff3bf;
                        auVar86 = vfmadd213ps_avx512vl(auVar86,auVar87,auVar30);
                        auVar87 = vpslld_avx(auVar169,0x17);
                        auVar86 = vpaddd_avx(auVar87,auVar86);
                        auVar87 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                        bVar84 = (bool)((byte)uVar77 & 1);
                        local_378.values.values[0] =
                             (float)((uint)bVar84 * auVar87._0_4_ |
                                    (uint)!bVar84 * (uint)((byte)uVar75 & 1) * auVar86._0_4_);
                        bVar84 = (bool)((byte)(uVar77 >> 1) & 1);
                        local_378.values.values[1] =
                             (float)((uint)bVar84 * auVar87._4_4_ |
                                    (uint)!bVar84 * (uint)((byte)(uVar75 >> 1) & 1) * auVar86._4_4_)
                        ;
                        bVar84 = (bool)((byte)(uVar77 >> 2) & 1);
                        local_378.values.values[2] =
                             (float)((uint)bVar84 * auVar87._8_4_ |
                                    (uint)!bVar84 * (uint)((byte)(uVar75 >> 2) & 1) * auVar86._8_4_)
                        ;
                        bVar84 = SUB81(uVar77 >> 3,0);
                        local_378.values.values[3] =
                             (float)((uint)bVar84 * auVar87._12_4_ |
                                    (uint)!bVar84 * (uint)(byte)(uVar75 >> 3) * auVar86._12_4_);
                        in_ZmmResult._16_48_ = auVar111;
                        in_ZmmResult._0_4_ = (int)local_378.values.values[0];
                        in_ZmmResult._4_4_ = local_378.values.values[1];
                        in_ZmmResult._8_4_ = local_378.values.values[2];
                        in_ZmmResult._12_4_ = local_378.values.values[3];
                        local_380 = false;
                        SampleLd::anon_class_32_4_b07b4888::operator()
                                  (&local_368,(MediumSample *)local_418);
                        puVar60 = stack0xfffffffffffffaf0;
                      }
                      else {
                        auVar125._0_4_ = auVar190._0_4_ * -fVar114;
                        auVar125._4_4_ = auVar190._4_4_ * -fVar114;
                        auVar125._8_4_ = auVar190._8_4_ * -fVar114;
                        auVar125._12_4_ = auVar190._12_4_ * -fVar114;
                        auVar19._8_4_ = 0x3fb8aa3b;
                        auVar19._0_8_ = 0x3fb8aa3b3fb8aa3b;
                        auVar19._12_4_ = 0x3fb8aa3b;
                        auVar86 = vmulps_avx512vl(auVar125,auVar19);
                        auVar87 = vroundps_avx(auVar86,9);
                        auVar86 = vsubps_avx(auVar86,auVar87);
                        auVar186 = ZEXT856(auVar86._8_8_);
                        auVar165._8_4_ = 0x3da1d5b6;
                        auVar165._0_8_ = 0x3da1d5b63da1d5b6;
                        auVar165._12_4_ = 0x3da1d5b6;
                        auVar20._8_4_ = 0x3e658299;
                        auVar20._0_8_ = 0x3e6582993e658299;
                        auVar20._12_4_ = 0x3e658299;
                        auVar91 = vfmadd213ps_avx512vl(auVar165,auVar86,auVar20);
                        auVar21._8_4_ = 0x3f3263b7;
                        auVar21._0_8_ = 0x3f3263b73f3263b7;
                        auVar21._12_4_ = 0x3f3263b7;
                        auVar91 = vfmadd213ps_avx512vl(auVar91,auVar86,auVar21);
                        auVar22._8_4_ = 0x3f7ff3bf;
                        auVar22._0_8_ = 0x3f7ff3bf3f7ff3bf;
                        auVar22._12_4_ = 0x3f7ff3bf;
                        local_4e8 = vfmadd213ps_avx512vl(auVar91,auVar86,auVar22);
                        auVar155 = ZEXT856(local_4e8._8_8_);
                        SVar225 = DenselySampledSpectrum::Sample(this_03 + 2,lambda);
                        auVar181._0_8_ = SVar225.values.values._8_8_;
                        auVar181._8_56_ = auVar155;
                        auVar148._0_8_ = SVar225.values.values._0_8_;
                        auVar148._8_56_ = auVar186;
                        auVar91 = vshufpd_avx(auVar196,auVar196,1);
                        auVar197._4_4_ = local_448._0_4_;
                        auVar197._0_4_ = local_448._0_4_;
                        auVar197._8_4_ = local_448._0_4_;
                        auVar197._12_4_ = local_448._0_4_;
                        auVar86 = vdivps_avx(local_308,auVar197);
                        auVar223 = ZEXT1664(auVar190);
                        auVar160 = vshufpd_avx(auVar190,auVar190,1);
                        local_538 = auVar87._0_4_;
                        fStack_534 = auVar87._4_4_;
                        fStack_530 = auVar87._8_4_;
                        fStack_52c = auVar87._12_4_;
                        auVar210._0_4_ = (int)local_538;
                        auVar210._4_4_ = (int)fStack_534;
                        auVar210._8_4_ = (int)fStack_530;
                        auVar210._12_4_ = (int)fStack_52c;
                        auVar23._8_4_ = 0xffffffe1;
                        auVar23._0_8_ = 0xffffffe1ffffffe1;
                        auVar23._12_4_ = 0xffffffe1;
                        uVar75 = vpcmpgtd_avx512vl(auVar210,auVar23);
                        uVar75 = uVar75 & 0xf;
                        auVar24._8_4_ = 0x1e;
                        auVar24._0_8_ = 0x1e0000001e;
                        auVar24._12_4_ = 0x1e;
                        uVar77 = vpcmpgtd_avx512vl(auVar210,auVar24);
                        uVar77 = uVar77 & 0xf;
                        auVar87 = vpslld_avx(auVar210,0x17);
                        auVar87 = vpaddd_avx(auVar87,local_4e8);
                        auVar188 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                        bVar84 = (bool)((byte)uVar77 & 1);
                        local_378.values.values[0] =
                             (float)((uint)bVar84 * auVar188._0_4_ |
                                    (uint)!bVar84 * (uint)((byte)uVar75 & 1) * auVar87._0_4_);
                        bVar84 = (bool)((byte)(uVar77 >> 1) & 1);
                        local_378.values.values[1] =
                             (float)((uint)bVar84 * auVar188._4_4_ |
                                    (uint)!bVar84 * (uint)((byte)(uVar75 >> 1) & 1) * auVar87._4_4_)
                        ;
                        bVar84 = (bool)((byte)(uVar77 >> 2) & 1);
                        local_378.values.values[2] =
                             (float)((uint)bVar84 * auVar188._8_4_ |
                                    (uint)!bVar84 * (uint)((byte)(uVar75 >> 2) & 1) * auVar87._8_4_)
                        ;
                        bVar84 = SUB81(uVar77 >> 3,0);
                        local_378.values.values[3] =
                             (float)((uint)bVar84 * auVar188._12_4_ |
                                    (uint)!bVar84 * (uint)(byte)(uVar75 >> 3) * auVar87._12_4_);
                        in_ZmmResult._16_48_ = auVar111;
                        in_ZmmResult._0_4_ = (int)local_378.values.values[0];
                        in_ZmmResult._4_4_ = local_378.values.values[1];
                        in_ZmmResult._8_4_ = local_378.values.values[2];
                        in_ZmmResult._12_4_ = local_378.values.values[3];
                        auVar87 = vmovshdup_avx(auVar86);
                        fVar113 = fVar114 * auVar86._0_4_ + (float)uVar4;
                        fVar112 = auVar87._0_4_ * fVar114 + (float)local_438._0_4_;
                        fVar114 = fVar114 * (fVar216 / (float)local_448._0_4_) +
                                  (float)local_2f8._0_4_;
                        auVar198._0_8_ = auVar86._0_8_ ^ 0x8000000080000000;
                        auVar198._8_4_ = auVar86._8_4_ ^ 0x80000000;
                        auVar198._12_4_ = auVar86._12_4_ ^ 0x80000000;
                        aIStack_408[2].high = -(fVar216 / (float)local_448._0_4_);
                        auVar202 = ZEXT1664(CONCAT412(0x80000000,
                                                      CONCAT48(0x80000000,
                                                               CONCAT44(0x80000000,
                                                                        aIStack_408[2].high))));
                        aIStack_408[7] = (Interval<float>)&this_03[0x66666666666].values.ptr;
                        aIStack_408[8] =
                             (Interval<float>)((ulong)&this_03[3].lambda_max | 0x1000000000000);
                        auVar214._4_4_ = fVar113;
                        auVar214._0_4_ = fVar113;
                        auVar214._8_4_ = fVar113;
                        auVar214._12_4_ = fVar113;
                        auVar217._4_4_ = fVar112;
                        auVar217._0_4_ = fVar112;
                        auVar217._8_4_ = fVar112;
                        auVar217._12_4_ = fVar112;
                        auVar86 = vmovlhps_avx(auVar214,auVar217);
                        auVar218._4_4_ = fVar114;
                        auVar218._0_4_ = fVar114;
                        auVar218._8_4_ = fVar114;
                        auVar218._12_4_ = fVar114;
                        aIStack_408._24_12_ = ZEXT812(0);
                        aIStack_408[4].high = 0;
                        aIStack_408[5].low = 0.0;
                        aIStack_408[0xb].low = (float)local_528._0_4_;
                        aIStack_408[0xb].high = (float)local_528._4_4_;
                        aIStack_408[0xc].low = fStack_520;
                        aIStack_408[0xc].high = fStack_51c;
                        local_380 = true;
                        local_418._0_4_ = auVar86._0_4_;
                        local_418._4_4_ = auVar86._4_4_;
                        local_418._8_4_ = auVar86._8_4_;
                        local_418._12_4_ = auVar86._12_4_;
                        uVar157 = vmovlps_avx(auVar218);
                        aIStack_408[0].low = (float)uVar157;
                        aIStack_408[0].high = (float)((ulong)uVar157 >> 0x20);
                        aIStack_408[1].low = fStack_500;
                        uVar157 = vmovlps_avx(auVar198);
                        aIStack_408[1].high = (float)uVar157;
                        aIStack_408[2].low = (float)((ulong)uVar157 >> 0x20);
                        aIStack_408[6].low = 0.0;
                        aIStack_408[6].high = 0.0;
                        aIStack_408._72_16_ = vunpcklpd_avx(auVar196,auVar91);
                        aIStack_408._104_16_ = vunpcklpd_avx(auVar190,auVar160);
                        aIStack_408._120_16_ = vmovlhps_avx(auVar148._0_16_,auVar181._0_16_);
                        SampleLd::anon_class_32_4_b07b4888::operator()
                                  (&local_368,(MediumSample *)local_418);
                        puVar60 = stack0xfffffffffffffaf0;
                      }
                      if (local_380 == true) {
                        local_380 = false;
                      }
                    }
                  }
                }
                else if (sVar49 == 3) {
                  local_368.throughput = (SampledSpectrum *)&local_2d8;
                  local_368.pdfLight = &local_2e8;
                  local_368.pdfUni = &local_258;
                  local_368.rng = &local_4d8;
                  auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fStack_508 * fStack_508)),
                                            ZEXT416((uint)fStack_50c),ZEXT416((uint)fStack_50c));
                  auVar86 = vfmadd213ss_fma(ZEXT416((uint)fStack_504),ZEXT416((uint)fStack_504),
                                            auVar86);
                  if (auVar86._0_4_ < 0.0) {
                    fVar113 = sqrtf(auVar86._0_4_);
                    puVar60 = stack0xfffffffffffffaf0;
                  }
                  else {
                    auVar86 = vsqrtss_avx(auVar86,auVar86);
                    fVar113 = auVar86._0_4_;
                  }
                  fStack_50c = (float)((ulong)puVar60 >> 0x20);
                  auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fStack_508 * fStack_508)),
                                            ZEXT416((uint)fStack_50c),ZEXT416((uint)fStack_50c));
                  auVar86 = vfmadd213ss_fma(ZEXT416((uint)fStack_504),ZEXT416((uint)fStack_504),
                                            auVar86);
                  if (auVar86._0_4_ < 0.0) {
                    unique0x10009295 = puVar60;
                    fVar112 = sqrtf(auVar86._0_4_);
                    puVar60 = stack0xfffffffffffffaf0;
                  }
                  else {
                    auVar86 = vsqrtss_avx(auVar86,auVar86);
                    fVar112 = auVar86._0_4_;
                  }
                  fVar156 = fStack_508;
                  fStack_50c = (float)((ulong)puVar60 >> 0x20);
                  fVar216 = fStack_50c;
                  local_518._8_4_ = SUB84(puVar60,0);
                  local_438._0_4_ = fStack_504;
                  auVar121._4_4_ = local_518._0_4_;
                  auVar121._0_4_ = local_518._0_4_;
                  auVar121._8_4_ = local_518._0_4_;
                  auVar121._12_4_ = local_518._0_4_;
                  auVar162._4_4_ = local_518._4_4_;
                  auVar162._0_4_ = local_518._4_4_;
                  auVar162._8_4_ = local_518._4_4_;
                  auVar162._12_4_ = local_518._4_4_;
                  _local_4a0 = vmovlhps_avx(auVar121,auVar162);
                  auVar163._4_4_ = local_518._8_4_;
                  auVar163._0_4_ = local_518._8_4_;
                  auVar163._8_4_ = local_518._8_4_;
                  auVar163._12_4_ = local_518._8_4_;
                  local_490 = (Interval<float>)vmovlps_avx(auVar163);
                  auVar223 = ZEXT1664(auVar87);
                  auVar224 = ZEXT1664(auVar91);
                  unique0x100092ad = puVar60;
                  Transform::operator()
                            ((Point3fi *)local_418,(Transform *)(this_03 + 3),(Point3fi *)local_4a0)
                  ;
                  local_4e8._0_4_ = fVar113 * fVar114;
                  auVar122._0_4_ = (float)local_438._0_4_ / fVar112;
                  auVar122._4_12_ = SUB6012((undefined1  [60])0x0,0);
                  fVar156 = fVar156 / fVar112;
                  auVar87 = ZEXT416((uint)(fVar216 / fVar112));
                  auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar156 * (float)this_03[3].lambda_max)),
                                            auVar87,ZEXT416((uint)this_03[3].lambda_min));
                  local_458 = vfmadd231ss_fma(auVar86,auVar122,
                                              ZEXT416(*(uint *)&this_03[3].values.alloc.
                                                                memoryResource));
                  auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar156 *
                                                          *(float *)((long)&this_03[3].values.ptr +
                                                                    4))),auVar87,
                                            ZEXT416(*(uint *)&this_03[3].values.ptr));
                  local_2b8 = vfmadd231ss_fma(auVar86,auVar122,
                                              ZEXT416((uint)this_03[3].values.nAlloc));
                  auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar156 *
                                                          *(float *)((long)&this_03[3].values.
                                                                            nStored + 4))),auVar87,
                                            ZEXT416((uint)this_03[3].values.nStored));
                  local_468 = vfmadd231ss_fma(auVar86,auVar122,ZEXT416((uint)this_03[4].lambda_min))
                  ;
                  auVar86 = vfmadd231ss_fma(ZEXT416((uint)(local_2b8._0_4_ * local_2b8._0_4_)),
                                            local_458,local_458);
                  auVar86 = vfmadd231ss_fma(auVar86,local_468,local_468);
                  puVar61 = (undefined1 *)local_418._8_8_;
                  IVar116 = aIStack_408[0];
                  puVar60 = stack0xfffffffffffffaf0;
                  if (0.0 < auVar86._0_4_) {
                    auVar195._8_4_ = 0x7fffffff;
                    auVar195._0_8_ = 0x7fffffff7fffffff;
                    auVar195._12_4_ = 0x7fffffff;
                    auVar87 = vandps_avx(local_458,auVar195);
                    auVar91 = vandps_avx(local_2b8,auVar195);
                    auVar160 = vandps_avx(local_468,auVar195);
                    auVar87 = vfmadd231ss_fma(ZEXT416((uint)(auVar91._0_4_ * 0.0)),
                                              ZEXT816(0) << 0x40,auVar87);
                    auVar87 = vfmadd231ss_fma(auVar87,ZEXT816(0) << 0x40,auVar160);
                    fVar113 = auVar87._0_4_ / auVar86._0_4_;
                    fVar114 = local_458._0_4_ * fVar113;
                    i_03.high = fVar114;
                    i_03.low = fVar114;
                    auVar141._0_8_ =
                         Interval<float>::operator+<float>((Interval<float> *)local_418,i_03);
                    auVar141._8_56_ = extraout_var_11;
                    uVar157 = vmovlps_avx(auVar141._0_16_);
                    local_418._0_4_ = (undefined4)uVar157;
                    local_418._4_4_ = (undefined4)((ulong)uVar157 >> 0x20);
                    i_04.high = fVar113 * (float)local_2b8._0_4_;
                    i_04.low = fVar113 * (float)local_2b8._0_4_;
                    auVar142._0_8_ =
                         Interval<float>::operator+<float>((Interval<float> *)(local_418 + 8),i_04);
                    auVar142._8_56_ = extraout_var_12;
                    uVar157 = vmovlps_avx(auVar142._0_16_);
                    local_418._8_4_ = (undefined4)uVar157;
                    local_418._12_4_ = (undefined4)((ulong)uVar157 >> 0x20);
                    i_05.high = fVar113 * (float)local_468._0_4_;
                    i_05.low = fVar113 * (float)local_468._0_4_;
                    auVar143._0_8_ = Interval<float>::operator+<float>(aIStack_408,i_05);
                    puVar61 = (undefined1 *)CONCAT44(local_418._12_4_,local_418._8_4_);
                    auVar143._8_56_ = extraout_var_13;
                    IVar116 = (Interval<float>)vmovlps_avx(auVar143._0_16_);
                    aIStack_408[0].low = SUB84(IVar116,0);
                    aIStack_408[0].high = (float)((ulong)IVar116 >> 0x20);
                    local_4e8._0_4_ = (float)local_4e8._0_4_ - fVar113;
                    puVar60 = stack0xfffffffffffffaf0;
                  }
                  aIStack_408[0].high = (float)((ulong)IVar116 >> 0x20);
                  aIStack_408[0].low = SUB84(IVar116,0);
                  local_418._12_4_ = (undefined4)((ulong)puVar61 >> 0x20);
                  local_418._8_4_ = SUB84(puVar61,0);
                  fVar114 = ((float)local_418._0_4_ + (float)local_418._4_4_) * 0.5;
                  fVar113 = ((float)local_418._8_4_ + (float)local_418._12_4_) * 0.5;
                  local_448._0_4_ = fVar113;
                  fVar112 = (aIStack_408[0].low + aIStack_408[0].high) * 0.5;
                  auVar86 = ZEXT816(0) << 0x40;
                  bVar84 = false;
                  uVar79 = 0;
                  do {
                    fVar216 = local_458._0_4_;
                    if ((uVar79 != 0) && (fVar216 = local_2b8._0_4_, uVar79 != 1)) {
                      fVar216 = local_468._0_4_;
                    }
                    pvVar80 = &this_03->values;
                    if ((uVar79 != 0) &&
                       (pvVar80 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                                  ((long)&(this_03->values).alloc.memoryResource + 4), uVar79 != 1))
                    {
                      pvVar80 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                                &(this_03->values).ptr;
                    }
                    fVar156 = fVar114;
                    if ((uVar79 != 0) && (fVar156 = fVar113, uVar79 != 1)) {
                      fVar156 = fVar112;
                    }
                    psVar81 = (size_t *)((long)&(this_03->values).ptr + 4);
                    if ((uVar79 != 0) && (psVar81 = &(this_03->values).nAlloc, uVar79 != 1)) {
                      psVar81 = (size_t *)((long)&(this_03->values).nAlloc + 4);
                    }
                    fVar200 = fVar114;
                    if ((uVar79 != 0) && (fVar200 = fVar113, uVar79 != 1)) {
                      fVar200 = fVar112;
                    }
                    auVar202 = ZEXT464(0x3f800000);
                    auVar91 = ZEXT416((uint)((1.0 / fVar216) * (*(float *)psVar81 - fVar200)));
                    auVar160 = ZEXT416((uint)((1.0 / fVar216) *
                                             (*(float *)&(pvVar80->alloc).memoryResource - fVar156))
                                      );
                    auVar87 = vminss_avx(auVar91,auVar160);
                    auVar86 = vmaxss_avx(auVar87,auVar86);
                    auVar87 = vmaxss_avx(auVar160,auVar91);
                    auVar87 = vminss_avx(ZEXT416((uint)(auVar87._0_4_ * 1.0000004)),
                                         ZEXT416((uint)local_4e8._0_4_));
                    auVar186 = ZEXT856(auVar87._8_8_);
                    local_4e8._0_4_ = auVar87._0_4_;
                    fVar216 = auVar86._0_4_;
                    if (auVar87._0_4_ < fVar216) break;
                    bVar84 = 1 < uVar79;
                    uVar79 = uVar79 + 1;
                  } while (uVar79 != 3);
                  local_418._8_8_ = puVar61;
                  aIStack_408[0] = IVar116;
                  if (bVar84) {
                    fVar113 = *(float *)&this_03[2].values.nStored;
                    uStack_540 = 0;
                    unique0x100092c5 = puVar60;
                    SVar225 = DenselySampledSpectrum::Sample
                                        ((DenselySampledSpectrum *)&(this_03->values).nStored,lambda
                                        );
                    auVar176._0_8_ = SVar225.values.values._8_8_;
                    auVar176._8_56_ = auVar186;
                    local_548 = (undefined1  [8])SVar225.values.values._0_8_;
                    fVar156 = *(float *)&this_03[2].values.nStored;
                    auVar155 = (undefined1  [56])0x0;
                    SVar225 = DenselySampledSpectrum::Sample
                                        ((DenselySampledSpectrum *)&this_03[1].values.nStored,lambda
                                        );
                    auVar177._0_8_ = SVar225.values.values._8_8_;
                    auVar177._8_56_ = auVar186;
                    auVar144._0_8_ = SVar225.values.values._0_8_;
                    auVar144._8_56_ = auVar155;
                    auVar86 = vunpcklpd_avx(_local_548,auVar176._0_16_);
                    local_348._0_4_ = fVar113 * auVar86._0_4_;
                    local_348._4_4_ = fVar113 * auVar86._4_4_;
                    fStack_340 = fVar113 * auVar86._8_4_;
                    fStack_33c = fVar113 * auVar86._12_4_;
                    auVar86 = vmovlhps_avx(auVar144._0_16_,auVar177._0_16_);
                    local_318._0_4_ = fVar156 * auVar86._0_4_;
                    local_318._4_4_ = fVar156 * auVar86._4_4_;
                    fStack_310 = fVar156 * auVar86._8_4_;
                    fStack_30c = fVar156 * auVar86._12_4_;
                    local_268._0_4_ = (float)local_318._0_4_ + (float)local_348._0_4_;
                    local_268._4_4_ = (float)local_318._4_4_ + (float)local_348._4_4_;
                    local_268._8_4_ = fStack_310 + fStack_340;
                    local_268._12_4_ = fStack_30c + fStack_33c;
                    auVar222 = ZEXT1664(local_268);
                    fVar113 = *(float *)&(this_03->values).alloc.memoryResource;
                    fVar156 = *(float *)((long)&(this_03->values).alloc.memoryResource + 4);
                    fVar193 = *(float *)((long)&(this_03->values).ptr + 4) - fVar113;
                    fVar201 = *(float *)&(this_03->values).nAlloc - fVar156;
                    fVar200 = *(float *)&(this_03->values).ptr;
                    fVar203 = *(float *)((long)&(this_03->values).nAlloc + 4) - fVar200;
                    local_4a4 = (float)local_458._0_4_ / fVar193;
                    local_4b8 = (float)local_2b8._0_4_ / fVar201;
                    local_4a8 = (float)local_468._0_4_ / fVar203;
                    fVar113 = (fVar114 - fVar113) / fVar193 + fVar216 * local_4a4;
                    fVar156 = ((float)local_448._0_4_ - fVar156) / fVar201 + fVar216 * local_4b8;
                    fVar200 = (fVar112 - fVar200) / fVar203 + fVar216 * local_4a8;
                    pvVar80 = &this_03[10].values;
                    fVar193 = 1.0 / (float)*(int *)&this_03[10].values.alloc.memoryResource;
                    pvVar2 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                             ((long)&this_03[10].values.alloc.memoryResource + 4);
                    fVar201 = 1.0 / (float)*(int *)((long)&this_03[10].values.alloc.memoryResource +
                                                   4);
                    auVar202 = ZEXT1664(ZEXT416((uint)fVar201));
                    ppfVar3 = &this_03[10].values.ptr;
                    fVar203 = 1.0 / (float)*(int *)&this_03[10].values.ptr;
                    lVar73 = 0;
                    do {
                      iVar85 = (int)lVar73;
                      pfVar83 = &local_4a4;
                      if ((iVar85 != 0) && (pfVar83 = &local_4a8, iVar85 == 1)) {
                        pfVar83 = &local_4b8;
                      }
                      if ((*pfVar83 == 0.0) && (!NAN(*pfVar83))) {
                        pfVar83 = &local_4a4;
                        if ((iVar85 != 0) && (pfVar83 = &local_4a8, iVar85 == 1)) {
                          pfVar83 = &local_4b8;
                        }
                        *pfVar83 = 0.0;
                      }
                      fVar207 = fVar113;
                      if ((iVar85 != 0) && (fVar207 = fVar156, iVar85 != 1)) {
                        fVar207 = fVar200;
                      }
                      pvVar76 = pvVar80;
                      if ((iVar85 != 0) && (pvVar76 = pvVar2, iVar85 != 1)) {
                        pvVar76 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)ppfVar3
                        ;
                      }
                      pvVar78 = pvVar80;
                      if ((iVar85 != 0) && (pvVar78 = pvVar2, iVar85 != 1)) {
                        pvVar78 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)ppfVar3
                        ;
                      }
                      auVar213._0_4_ = (float)(*(int *)&(pvVar78->alloc).memoryResource + -1);
                      auVar213._4_12_ = auVar223._4_12_;
                      auVar87 = ZEXT416((uint)(fVar207 *
                                              (float)*(int *)&(pvVar76->alloc).memoryResource));
                      auVar86 = vminss_avx(auVar213,auVar87);
                      uVar157 = vcmpss_avx512f(auVar87,ZEXT816(0) << 0x40,1);
                      auVar99._16_48_ = in_ZmmResult._16_48_;
                      auVar99._0_16_ = auVar86;
                      fVar207 = (float)((uint)!(bool)((byte)uVar157 & 1) * auVar86._0_4_);
                      in_ZmmResult._4_60_ = auVar99._4_60_;
                      in_ZmmResult._0_4_ = (int)fVar207;
                      iVar74 = (int)fVar207;
                      local_4b4[lVar73] = iVar74;
                      pfVar83 = &local_4a4;
                      if ((iVar85 != 0) && (pfVar83 = &local_4a8, iVar85 == 1)) {
                        pfVar83 = &local_4b8;
                      }
                      if (0.0 <= *pfVar83) {
                        pvVar76 = pvVar80;
                        if ((iVar85 != 0) && (pvVar76 = pvVar2, iVar85 != 1)) {
                          pvVar76 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                                    ppfVar3;
                        }
                        fVar207 = fVar113;
                        if ((iVar85 != 0) && (fVar207 = fVar156, iVar85 != 1)) {
                          fVar207 = fVar200;
                        }
                        pfVar83 = &local_4a4;
                        if ((iVar85 != 0) && (pfVar83 = &local_4a8, iVar85 == 1)) {
                          pfVar83 = &local_4b8;
                        }
                        *(float *)(local_4a0 + lVar73 * 4) =
                             fVar216 + ((float)(iVar74 + 1) /
                                        (float)*(int *)&(pvVar76->alloc).memoryResource - fVar207) /
                                       *pfVar83;
                        fVar207 = fVar193;
                        if ((iVar85 != 0) && (fVar207 = fVar201, iVar85 != 1)) {
                          fVar207 = fVar203;
                        }
                        pfVar83 = &local_4a4;
                        if ((iVar85 != 0) && (pfVar83 = &local_4a8, iVar85 == 1)) {
                          pfVar83 = &local_4b8;
                        }
                        afStack_324[lVar73] = fVar207 / *pfVar83;
                        aiStack_330[lVar73] = 1;
                        pvVar76 = pvVar80;
                        if ((iVar85 != 0) && (pvVar76 = pvVar2, iVar85 != 1)) {
                          pvVar76 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                                    ppfVar3;
                        }
                        iVar85 = *(int *)&(pvVar76->alloc).memoryResource;
                      }
                      else {
                        pvVar76 = pvVar80;
                        if ((iVar85 != 0) && (pvVar76 = pvVar2, iVar85 != 1)) {
                          pvVar76 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                                    ppfVar3;
                        }
                        fVar207 = fVar113;
                        if ((iVar85 != 0) && (fVar207 = fVar156, iVar85 != 1)) {
                          fVar207 = fVar200;
                        }
                        pfVar83 = &local_4a4;
                        if ((iVar85 != 0) && (pfVar83 = &local_4a8, iVar85 == 1)) {
                          pfVar83 = &local_4b8;
                        }
                        *(float *)(local_4a0 + lVar73 * 4) =
                             fVar216 + ((float)iVar74 /
                                        (float)*(int *)&(pvVar76->alloc).memoryResource - fVar207) /
                                       *pfVar83;
                        auVar86 = ZEXT416((uint)fVar193);
                        if ((iVar85 != 0) && (auVar86 = ZEXT416((uint)fVar201), iVar85 != 1)) {
                          auVar86 = ZEXT416((uint)fVar203);
                        }
                        pfVar83 = &local_4a4;
                        if ((iVar85 != 0) && (pfVar83 = &local_4a8, iVar85 == 1)) {
                          pfVar83 = &local_4b8;
                        }
                        auVar31._8_4_ = 0x80000000;
                        auVar31._0_8_ = 0x8000000080000000;
                        auVar31._12_4_ = 0x80000000;
                        in_ZmmResult._0_16_ = vxorps_avx512vl(auVar86,auVar31);
                        in_ZmmResult._16_48_ = auVar99._16_48_;
                        afStack_324[lVar73] = in_ZmmResult._0_4_ / *pfVar83;
                        aiStack_330[lVar73] = -1;
                        iVar85 = -1;
                      }
                      aiStack_274[lVar73] = iVar85;
                      lVar73 = lVar73 + 1;
                    } while (lVar73 != 3);
                    uVar79 = (uint)(local_4d8.state >> 0x2d) ^ (uint)(local_4d8.state >> 0x1b);
                    bVar72 = (byte)(local_4d8.state >> 0x3b);
                    auVar86 = vcvtusi2ss_avx512f(auVar223._0_16_,
                                                 uVar79 >> bVar72 | uVar79 << 0x20 - bVar72);
                    auVar86 = vminss_avx(ZEXT416((uint)(auVar86._0_4_ * 2.3283064e-10)),
                                         ZEXT416(0x3f7fffff));
                    local_568 = ZEXT416(auVar86._0_4_);
                    local_4d8.state = local_4d8.state * 0x5851f42d4c957f2d + local_4d8.inc;
                    puVar60 = stack0xfffffffffffffaf0;
                    do {
                      lVar73 = (long)*(int *)(&DAT_005e6660 +
                                             (ulong)((uint)((float)local_4a0._4_4_ < IStack_498.low)
                                                    | (uint)((float)local_4a0._0_4_ <
                                                            (float)local_4a0._4_4_) * 4 +
                                                      (uint)((float)local_4a0._0_4_ < IStack_498.low
                                                            ) * 2) * 4);
                      fVar113 = *(float *)(local_4a0 + lVar73 * 4);
                      uVar4 = *(undefined4 *)
                               (this_03[9].values.nAlloc +
                               (((long)local_4b4[2] *
                                 (long)*(int *)((long)&this_03[10].values.alloc.memoryResource + 4)
                                + (long)local_4b4[1]) *
                                (long)*(int *)&this_03[10].values.alloc.memoryResource +
                               (long)local_4b4[0]) * 4);
                      auVar32._4_4_ = uVar4;
                      auVar32._0_4_ = uVar4;
                      auVar32._8_4_ = uVar4;
                      auVar32._12_4_ = uVar4;
                      auVar100._16_48_ = in_ZmmResult._16_48_;
                      auVar100._0_16_ = vmulps_avx512vl(auVar222._0_16_,auVar32);
                      in_ZmmResult = auVar100;
                      if (auVar100._0_4_ <= 0.0) {
LAB_0041b19e:
                        fVar156 = *(float *)(local_4a0 + lVar73 * 4);
                        if (((float)local_4e8._0_4_ < fVar156) ||
                           (iVar85 = local_4b4[lVar73],
                           local_4b4[lVar73] = iVar85 + aiStack_330[lVar73],
                           iVar85 + aiStack_330[lVar73] == aiStack_274[lVar73])) {
                          bVar84 = false;
                        }
                        else {
                          *(float *)(local_4a0 + lVar73 * 4) = fVar156 + afStack_324[lVar73];
                          bVar84 = true;
                          fVar216 = fVar113;
                        }
                      }
                      else {
                        auVar33._8_4_ = 0x80000000;
                        auVar33._0_8_ = 0x8000000080000000;
                        auVar33._12_4_ = 0x80000000;
                        auVar101._0_16_ = vxorps_avx512vl(auVar100._0_16_,auVar33);
                        auVar101._16_48_ = auVar100._16_48_;
                        in_ZmmResult = auVar101;
                        do {
                          local_548._0_4_ = auVar101._0_4_;
                          unique0x100093a5 = puVar60;
                          fVar156 = expf((fVar113 - fVar216) * (float)local_548._0_4_);
                          fVar156 = 1.0 - fVar156;
                          if (fVar156 <= (float)local_568._0_4_) {
                            auVar86 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                                                 ZEXT416((uint)(((float)local_568._0_4_ - fVar156) /
                                                               (1.0 - fVar156))));
                            local_568._0_4_ = auVar86._0_4_;
                            iVar85 = 8;
                            puVar60 = stack0xfffffffffffffaf0;
                          }
                          else {
                            fVar156 = logf(1.0 - (float)local_568._0_4_);
                            fVar156 = fVar216 - fVar156 / auVar100._0_4_;
                            auVar202 = ZEXT464((uint)fVar156);
                            if ((float)local_4e8._0_4_ <= fVar156) {
                              local_380 = false;
                              local_378.values.values[2] = 1.0;
                              local_378.values.values[0] = 1.0;
                              local_378.values.values[1] = 1.0;
                              local_378.values.values[3] = 1.0;
                              SampleLd::anon_class_32_4_b07b4888::operator()
                                        (&local_368,(MediumSample *)local_418);
                              if (local_380 == true) {
                                local_380 = false;
                              }
                              iVar85 = 1;
                              puVar60 = stack0xfffffffffffffaf0;
                            }
                            else {
                              auVar86 = vinsertps_avx(ZEXT416((uint)(fVar156 * (float)local_458.
                                                                                      _0_4_ +
                                                                    fVar114)),
                                                      ZEXT416((uint)(fVar156 * (float)local_2b8.
                                                                                      _0_4_ +
                                                                    (float)local_448._0_4_)),0x10);
                              local_4c8.z = fVar156 * (float)local_468._0_4_ + fVar112;
                              local_4c8._0_8_ = vmovlps_avx(auVar86);
                              local_308._0_4_ = fVar156;
                              fVar156 = fVar156 - fVar216;
                              local_548._4_4_ = auVar101._4_4_;
                              uStack_540._0_4_ = auVar101._8_4_;
                              uStack_540._4_4_ = auVar101._12_4_;
                              auVar123._0_4_ = fVar156 * (float)local_548._0_4_;
                              auVar123._4_4_ = fVar156 * (float)local_548._4_4_;
                              auVar123._8_4_ = fVar156 * (float)uStack_540;
                              auVar123._12_4_ = fVar156 * uStack_540._4_4_;
                              auVar34._8_4_ = 0x3fb8aa3b;
                              auVar34._0_8_ = 0x3fb8aa3b3fb8aa3b;
                              auVar34._12_4_ = 0x3fb8aa3b;
                              auVar111 = in_ZmmResult._16_48_;
                              auVar86 = vmulps_avx512vl(auVar123,auVar34);
                              _local_2f8 = vroundps_avx(auVar86,9);
                              auVar86 = vsubps_avx(auVar86,_local_2f8);
                              auVar186 = ZEXT856(auVar86._8_8_);
                              auVar164._8_4_ = 0x3da1d5b6;
                              auVar164._0_8_ = 0x3da1d5b63da1d5b6;
                              auVar164._12_4_ = 0x3da1d5b6;
                              auVar35._8_4_ = 0x3e658299;
                              auVar35._0_8_ = 0x3e6582993e658299;
                              auVar35._12_4_ = 0x3e658299;
                              auVar87 = vfmadd213ps_avx512vl(auVar164,auVar86,auVar35);
                              auVar36._8_4_ = 0x3f3263b7;
                              auVar36._0_8_ = 0x3f3263b73f3263b7;
                              auVar36._12_4_ = 0x3f3263b7;
                              auVar87 = vfmadd213ps_avx512vl(auVar87,auVar86,auVar36);
                              auVar37._8_4_ = 0x3f7ff3bf;
                              auVar37._0_8_ = 0x3f7ff3bf3f7ff3bf;
                              auVar37._12_4_ = 0x3f7ff3bf;
                              local_438 = vfmadd213ps_avx512vl(auVar87,auVar86,auVar37);
                              auVar155 = ZEXT856(local_438._8_8_);
                              SVar225 = CloudMediumProvider::Density
                                                  (*(CloudMediumProvider **)this_03,
                                                   (Point3f *)&local_4c8,lambda);
                              auVar178._0_8_ = SVar225.values.values._8_8_;
                              auVar178._8_56_ = auVar155;
                              auVar145._0_8_ = SVar225.values.values._0_8_;
                              auVar145._8_56_ = auVar186;
                              auVar86 = vfmadd231ss_fma(ZEXT416((uint)(local_4c8.y *
                                                                      *(float *)((long)&this_03[6].
                                                                                        values.alloc
                                                                                        .
                                                  memoryResource + 4))),ZEXT416((uint)local_4c8.x),
                                                  ZEXT416(*(uint *)&this_03[6].values.alloc.
                                                                    memoryResource));
                              auVar86 = vfmadd231ss_fma(auVar86,ZEXT416((uint)local_4c8.z),
                                                        ZEXT416(*(uint *)&this_03[6].values.ptr));
                              fVar156 = auVar86._0_4_ + *(float *)((long)&this_03[6].values.ptr + 4)
                              ;
                              auVar86 = vfmadd231ss_fma(ZEXT416((uint)(local_4c8.y *
                                                                      *(float *)((long)&this_03[6].
                                                                                        values.
                                                  nAlloc + 4))),ZEXT416((uint)local_4c8.x),
                                                  ZEXT416((uint)this_03[6].values.nAlloc));
                              auVar86 = vfmadd231ss_fma(auVar86,ZEXT416((uint)local_4c8.z),
                                                        ZEXT416((uint)this_03[6].values.nStored));
                              fVar200 = auVar86._0_4_ +
                                        *(float *)((long)&this_03[6].values.nStored + 4);
                              auVar86 = vfmadd231ss_fma(ZEXT416((uint)(local_4c8.y *
                                                                      (float)this_03[7].lambda_max))
                                                        ,ZEXT416((uint)local_4c8.x),
                                                        ZEXT416((uint)this_03[7].lambda_min));
                              auVar86 = vfmadd231ss_fma(auVar86,ZEXT416((uint)local_4c8.z),
                                                        ZEXT416(*(uint *)&this_03[7].values.alloc.
                                                                          memoryResource));
                              fVar193 = auVar86._0_4_ +
                                        *(float *)((long)&this_03[7].values.alloc.memoryResource + 4
                                                  );
                              auVar86 = vfmadd231ss_fma(ZEXT416((uint)(local_4c8.y *
                                                                      *(float *)((long)&this_03[7].
                                                                                        values.ptr +
                                                                                4))),
                                                        ZEXT416((uint)local_4c8.x),
                                                        ZEXT416(*(uint *)&this_03[7].values.ptr));
                              auVar86 = vfmadd231ss_fma(auVar86,ZEXT416((uint)local_4c8.z),
                                                        ZEXT416((uint)this_03[7].values.nAlloc));
                              fVar201 = auVar86._0_4_ +
                                        *(float *)((long)&this_03[7].values.nAlloc + 4);
                              bVar84 = fVar201 == 1.0;
                              auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fStack_508 * fStack_508)),
                                                        ZEXT416((uint)fStack_50c),
                                                        ZEXT416((uint)fStack_50c));
                              auVar86 = vfmadd213ss_fma(ZEXT416((uint)fStack_504),
                                                        ZEXT416((uint)fStack_504),auVar86);
                              if (auVar86._0_4_ < 0.0) {
                                local_208 = ZEXT416((uint)fVar156);
                                local_218 = ZEXT416((uint)fVar200);
                                local_228 = ZEXT416((uint)fVar193);
                                local_238._0_4_ = fVar201;
                                _local_1f8 = auVar178._0_16_;
                                _local_1e8 = auVar145._0_16_;
                                fVar203 = sqrtf(auVar86._0_4_);
                                fVar201 = (float)local_238._0_4_;
                                auVar87 = local_208;
                                auVar91 = local_228;
                                auVar86 = _local_1e8;
                                fVar200 = (float)local_218._0_4_;
                                auVar160 = _local_1f8;
                                puVar60 = stack0xfffffffffffffaf0;
                              }
                              else {
                                auVar86 = vsqrtss_avx(auVar86,auVar86);
                                fVar203 = auVar86._0_4_;
                                auVar87 = ZEXT416((uint)fVar156);
                                auVar91 = ZEXT416((uint)fVar193);
                                auVar86 = auVar145._0_16_;
                                auVar160 = auVar178._0_16_;
                                puVar60 = stack0xfffffffffffffaf0;
                              }
                              TVar68.bits = local_4f8.bits;
                              fStack_50c = (float)((ulong)puVar60 >> 0x20);
                              auVar189._0_4_ = (int)(float)local_2f8._0_4_;
                              auVar189._4_4_ = (int)(float)local_2f8._4_4_;
                              auVar189._8_4_ = (int)fStack_2f0;
                              auVar189._12_4_ = (int)fStack_2ec;
                              auVar38._8_4_ = 0xffffffe1;
                              auVar38._0_8_ = 0xffffffe1ffffffe1;
                              auVar38._12_4_ = 0xffffffe1;
                              uVar75 = vpcmpgtd_avx512vl(auVar189,auVar38);
                              uVar75 = uVar75 & 0xf;
                              auVar39._8_4_ = 0x1e;
                              auVar39._0_8_ = 0x1e0000001e;
                              auVar39._12_4_ = 0x1e;
                              uVar77 = vpcmpgtd_avx512vl(auVar189,auVar39);
                              uVar77 = uVar77 & 0xf;
                              auVar188 = vpslld_avx(auVar189,0x17);
                              auVar188 = vpaddd_avx(auVar188,local_438);
                              auVar88 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                              bVar9 = (bool)((byte)uVar77 & 1);
                              auVar90._0_4_ =
                                   (uint)bVar9 * auVar88._0_4_ |
                                   (uint)!bVar9 * (uint)((byte)uVar75 & 1) * auVar188._0_4_;
                              bVar9 = (bool)((byte)(uVar77 >> 1) & 1);
                              auVar90._4_4_ =
                                   (uint)bVar9 * auVar88._4_4_ |
                                   (uint)!bVar9 * (uint)((byte)(uVar75 >> 1) & 1) * auVar188._4_4_;
                              bVar9 = (bool)((byte)(uVar77 >> 2) & 1);
                              auVar90._8_4_ =
                                   (uint)bVar9 * auVar88._8_4_ |
                                   (uint)!bVar9 * (uint)((byte)(uVar75 >> 2) & 1) * auVar188._8_4_;
                              bVar9 = SUB81(uVar77 >> 3,0);
                              auVar90._12_4_ =
                                   (uint)bVar9 * auVar88._12_4_ |
                                   (uint)!bVar9 * (uint)(byte)(uVar75 >> 3) * auVar188._12_4_;
                              auVar188 = vshufpd_avx(auVar90,auVar90,1);
                              auVar86 = vmovlhps_avx(auVar86,auVar160);
                              fVar156 = auVar87._0_4_ / fVar201;
                              auVar103._4_12_ = auVar87._4_12_;
                              auVar103._0_4_ = fVar156;
                              fVar193 = auVar91._0_4_ / fVar201;
                              auVar104._4_12_ = auVar91._4_12_;
                              auVar104._0_4_ = fVar193;
                              auVar103._16_48_ = auVar111;
                              auVar102._4_60_ = auVar103._4_60_;
                              auVar102._0_4_ =
                                   (uint)bVar84 * (int)auVar87._0_4_ + (uint)!bVar84 * (int)fVar156;
                              iVar85 = (uint)bVar84 * (int)fVar200 +
                                       (uint)!bVar84 * (int)(fVar200 / fVar201);
                              auVar104._16_48_ = auVar111;
                              in_ZmmResult._4_60_ = auVar104._4_60_;
                              in_ZmmResult._0_4_ =
                                   (uint)bVar84 * (int)auVar91._0_4_ + (uint)!bVar84 * (int)fVar193;
                              aIStack_408[9].low = auVar86._0_4_ * (float)local_348._0_4_;
                              aIStack_408[9].high = auVar86._4_4_ * (float)local_348._4_4_;
                              aIStack_408[10].low = auVar86._8_4_ * fStack_340;
                              aIStack_408[10].high = auVar86._12_4_ * fStack_33c;
                              aIStack_408[0xb].low = auVar86._0_4_ * (float)local_318._0_4_;
                              aIStack_408[0xb].high = auVar86._4_4_ * (float)local_318._4_4_;
                              aIStack_408[0xc].low = auVar86._8_4_ * fStack_310;
                              aIStack_408[0xc].high = auVar86._12_4_ * fStack_30c;
                              aIStack_408[2].high = -fStack_504 / fVar203;
                              auVar220._0_8_ = CONCAT44(fStack_508,fStack_50c) ^ 0x8000000080000000;
                              auVar220._8_4_ = 0x80000000;
                              auVar220._12_4_ = 0x80000000;
                              auVar124._4_4_ = fVar203;
                              auVar124._0_4_ = fVar203;
                              auVar124._8_4_ = fVar203;
                              auVar124._12_4_ = fVar203;
                              auVar86 = vdivps_avx(auVar220,auVar124);
                              auVar205._4_4_ = iVar85;
                              auVar205._0_4_ = iVar85;
                              auVar205._8_4_ = iVar85;
                              auVar205._12_4_ = iVar85;
                              auVar209._4_4_ = in_ZmmResult._0_4_;
                              auVar209._0_4_ = in_ZmmResult._0_4_;
                              auVar209._8_4_ = in_ZmmResult._0_4_;
                              auVar209._12_4_ = in_ZmmResult._0_4_;
                              aIStack_408._24_16_ =
                                   ZEXT416((uint)(auVar220._0_8_ >> 0x20) ^ (uint)-fStack_508) <<
                                   0x20;
                              aIStack_408[5].low = 0.0;
                              auVar223 = ZEXT1664(auVar100._0_16_);
                              local_380 = true;
                              auVar87 = vshufps_avx(auVar102._0_16_,auVar205,0x40);
                              auVar202 = ZEXT1664(auVar87);
                              local_418._0_4_ = auVar87._0_4_;
                              local_418._4_4_ = auVar87._4_4_;
                              local_418._8_4_ = auVar87._8_4_;
                              local_418._12_4_ = auVar87._12_4_;
                              uVar157 = vmovlps_avx(auVar209);
                              aIStack_408[0].low = (float)uVar157;
                              aIStack_408[0].high = (float)((ulong)uVar157 >> 0x20);
                              aIStack_408[1].low = fStack_500;
                              uVar157 = vmovlps_avx(auVar86);
                              aIStack_408[1].high = (float)uVar157;
                              aIStack_408[2].low = (float)((ulong)uVar157 >> 0x20);
                              aIStack_408[6].low = 0.0;
                              aIStack_408[6].high = 0.0;
                              local_4f8.bits._0_4_ = (undefined4)TVar67.bits;
                              local_4f8.bits._4_4_ = SUB84(TVar67.bits,4);
                              aIStack_408[7].low = (float)(undefined4)local_4f8.bits;
                              aIStack_408[7].high = (float)local_4f8.bits._4_4_;
                              local_378.values.values =
                                   (array<float,_4>)vunpcklpd_avx(auVar90,auVar188);
                              local_4f8.bits = TVar68.bits;
                              aIStack_408[8] =
                                   (Interval<float>)
                                   ((ulong)((long)&this_03[2].values.nStored + 4U) | 0x1000000000000
                                   );
                              aIStack_408._104_16_ = auVar100._0_16_;
                              aIStack_408._120_16_ = aIStack_408._24_16_;
                              unique0x100094d5 = puVar60;
                              bVar84 = SampleLd::anon_class_32_4_b07b4888::operator()
                                                 (&local_368,(MediumSample *)local_418);
                              aVar62._4_4_ = local_418._4_4_;
                              aVar62._0_4_ = local_418._0_4_;
                              if (local_380 == true) {
                                local_380 = false;
                              }
                              iVar85 = 1;
                              local_418._8_8_ =
                                   (undefined1 *)CONCAT44(local_418._12_4_,local_418._8_4_);
                              aIStack_408[0] =
                                   (Interval<float>)CONCAT44(aIStack_408[0].high,aIStack_408[0].low)
                              ;
                              aIStack_408[1] =
                                   (Interval<float>)CONCAT44(aIStack_408[1].high,aIStack_408[1].low)
                              ;
                              puVar60 = stack0xfffffffffffffaf0;
                              if (bVar84) {
                                uVar79 = (uint)(local_4d8.state >> 0x2d) ^
                                         (uint)(local_4d8.state >> 0x1b);
                                bVar72 = (byte)(local_4d8.state >> 0x3b);
                                auVar86 = vcvtusi2ss_avx512f(auVar224._0_16_,
                                                             uVar79 >> bVar72 |
                                                             uVar79 << 0x20 - bVar72);
                                auVar86 = vminss_avx(ZEXT416((uint)(auVar86._0_4_ * 2.3283064e-10)),
                                                     ZEXT416(0x3f7fffff));
                                local_568._0_4_ = auVar86._0_4_;
                                iVar85 = 0;
                                local_4d8.state =
                                     local_4d8.state * 0x5851f42d4c957f2d + local_4d8.inc;
                                fVar216 = (float)local_308._0_4_;
                                local_418._0_8_ = aVar62;
                                local_418._8_8_ =
                                     (undefined1 *)CONCAT44(local_418._12_4_,local_418._8_4_);
                                aIStack_408[0] =
                                     (Interval<float>)
                                     CONCAT44(aIStack_408[0].high,aIStack_408[0].low);
                                aIStack_408[1] =
                                     (Interval<float>)
                                     CONCAT44(aIStack_408[1].high,aIStack_408[1].low);
                              }
                            }
                          }
                        } while (iVar85 == 0);
                        if (iVar85 == 8) {
                          auVar222 = ZEXT1664(local_268);
                          goto LAB_0041b19e;
                        }
                        bVar84 = false;
                        auVar222 = ZEXT1664(local_268);
                      }
                      pVVar82 = local_420;
                    } while (bVar84);
                  }
                }
                else {
                  local_368.throughput = (SampledSpectrum *)&local_2d8;
                  local_368.pdfLight = &local_2e8;
                  local_368.pdfUni = &local_258;
                  local_368.rng = &local_4d8;
                  auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fStack_508 * fStack_508)),
                                            ZEXT416((uint)fStack_50c),ZEXT416((uint)fStack_50c));
                  auVar86 = vfmadd213ss_fma(ZEXT416((uint)fStack_504),ZEXT416((uint)fStack_504),
                                            auVar86);
                  if (auVar86._0_4_ < 0.0) {
                    fVar113 = sqrtf(auVar86._0_4_);
                    puVar60 = stack0xfffffffffffffaf0;
                  }
                  else {
                    auVar86 = vsqrtss_avx(auVar86,auVar86);
                    fVar113 = auVar86._0_4_;
                  }
                  fStack_50c = (float)((ulong)puVar60 >> 0x20);
                  auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fStack_508 * fStack_508)),
                                            ZEXT416((uint)fStack_50c),ZEXT416((uint)fStack_50c));
                  auVar86 = vfmadd213ss_fma(ZEXT416((uint)fStack_504),ZEXT416((uint)fStack_504),
                                            auVar86);
                  if (auVar86._0_4_ < 0.0) {
                    unique0x1000921d = puVar60;
                    fVar112 = sqrtf(auVar86._0_4_);
                    puVar60 = stack0xfffffffffffffaf0;
                  }
                  else {
                    auVar86 = vsqrtss_avx(auVar86,auVar86);
                    fVar112 = auVar86._0_4_;
                  }
                  fVar156 = fStack_508;
                  fStack_50c = (float)((ulong)puVar60 >> 0x20);
                  fVar216 = fStack_50c;
                  local_518._8_4_ = SUB84(puVar60,0);
                  local_438._0_4_ = fStack_504;
                  auVar126._4_4_ = local_518._0_4_;
                  auVar126._0_4_ = local_518._0_4_;
                  auVar126._8_4_ = local_518._0_4_;
                  auVar126._12_4_ = local_518._0_4_;
                  auVar166._4_4_ = local_518._4_4_;
                  auVar166._0_4_ = local_518._4_4_;
                  auVar166._8_4_ = local_518._4_4_;
                  auVar166._12_4_ = local_518._4_4_;
                  _local_4a0 = vmovlhps_avx(auVar126,auVar166);
                  auVar167._4_4_ = local_518._8_4_;
                  auVar167._0_4_ = local_518._8_4_;
                  auVar167._8_4_ = local_518._8_4_;
                  auVar167._12_4_ = local_518._8_4_;
                  local_490 = (Interval<float>)vmovlps_avx(auVar167);
                  auVar223 = ZEXT1664(auVar87);
                  auVar224 = ZEXT1664(auVar91);
                  unique0x10009255 = puVar60;
                  Transform::operator()
                            ((Point3fi *)local_418,(Transform *)(this_03 + 3),(Point3fi *)local_4a0)
                  ;
                  local_4e8._0_4_ = fVar113 * fVar114;
                  auVar87._0_4_ = (float)local_438._0_4_ / fVar112;
                  auVar87._4_12_ = SUB6012((undefined1  [60])0x0,0);
                  fVar156 = fVar156 / fVar112;
                  auVar91 = ZEXT416((uint)(fVar216 / fVar112));
                  auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar156 * (float)this_03[3].lambda_max)),
                                            auVar91,ZEXT416((uint)this_03[3].lambda_min));
                  _local_318 = vfmadd231ss_fma(auVar86,auVar87,
                                               ZEXT416(*(uint *)&this_03[3].values.alloc.
                                                                 memoryResource));
                  auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar156 *
                                                          *(float *)((long)&this_03[3].values.ptr +
                                                                    4))),auVar91,
                                            ZEXT416(*(uint *)&this_03[3].values.ptr));
                  local_458 = vfmadd231ss_fma(auVar86,auVar87,
                                              ZEXT416((uint)this_03[3].values.nAlloc));
                  auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar156 *
                                                          *(float *)((long)&this_03[3].values.
                                                                            nStored + 4))),auVar91,
                                            ZEXT416((uint)this_03[3].values.nStored));
                  _local_348 = vfmadd231ss_fma(auVar86,auVar87,ZEXT416((uint)this_03[4].lambda_min))
                  ;
                  auVar86 = vfmadd231ss_fma(ZEXT416((uint)(local_458._0_4_ * local_458._0_4_)),
                                            _local_318,_local_318);
                  auVar86 = vfmadd231ss_fma(auVar86,_local_348,_local_348);
                  puVar61 = (undefined1 *)local_418._8_8_;
                  IVar116 = aIStack_408[0];
                  puVar60 = stack0xfffffffffffffaf0;
                  if (0.0 < auVar86._0_4_) {
                    auVar199._8_4_ = 0x7fffffff;
                    auVar199._0_8_ = 0x7fffffff7fffffff;
                    auVar199._12_4_ = 0x7fffffff;
                    auVar87 = vandps_avx(_local_318,auVar199);
                    auVar91 = vandps_avx(local_458,auVar199);
                    auVar160 = vandps_avx(_local_348,auVar199);
                    auVar87 = vfmadd231ss_fma(ZEXT416((uint)(auVar91._0_4_ * 0.0)),
                                              ZEXT816(0) << 0x40,auVar87);
                    auVar87 = vfmadd231ss_fma(auVar87,ZEXT816(0) << 0x40,auVar160);
                    fVar113 = auVar87._0_4_ / auVar86._0_4_;
                    fVar114 = local_318._0_4_ * fVar113;
                    IVar116.high = fVar114;
                    IVar116.low = fVar114;
                    auVar149._0_8_ =
                         Interval<float>::operator+<float>((Interval<float> *)local_418,IVar116);
                    auVar149._8_56_ = extraout_var_14;
                    uVar157 = vmovlps_avx(auVar149._0_16_);
                    local_418._0_4_ = (undefined4)uVar157;
                    local_418._4_4_ = (undefined4)((ulong)uVar157 >> 0x20);
                    i_06.high = fVar113 * (float)local_458._0_4_;
                    i_06.low = fVar113 * (float)local_458._0_4_;
                    auVar150._0_8_ =
                         Interval<float>::operator+<float>((Interval<float> *)(local_418 + 8),i_06);
                    auVar150._8_56_ = extraout_var_15;
                    uVar157 = vmovlps_avx(auVar150._0_16_);
                    local_418._8_4_ = (undefined4)uVar157;
                    local_418._12_4_ = (undefined4)((ulong)uVar157 >> 0x20);
                    i_07.high = fVar113 * (float)local_348._0_4_;
                    i_07.low = fVar113 * (float)local_348._0_4_;
                    auVar151._0_8_ = Interval<float>::operator+<float>(aIStack_408,i_07);
                    puVar61 = (undefined1 *)CONCAT44(local_418._12_4_,local_418._8_4_);
                    auVar151._8_56_ = extraout_var_16;
                    IVar116 = (Interval<float>)vmovlps_avx(auVar151._0_16_);
                    aIStack_408[0].low = SUB84(IVar116,0);
                    aIStack_408[0].high = (float)((ulong)IVar116 >> 0x20);
                    local_4e8._0_4_ = (float)local_4e8._0_4_ - fVar113;
                    puVar60 = stack0xfffffffffffffaf0;
                  }
                  aIStack_408[0].high = (float)((ulong)IVar116 >> 0x20);
                  aIStack_408[0].low = SUB84(IVar116,0);
                  local_418._12_4_ = (undefined4)((ulong)puVar61 >> 0x20);
                  local_418._8_4_ = SUB84(puVar61,0);
                  fVar114 = ((float)local_418._0_4_ + (float)local_418._4_4_) * 0.5;
                  fVar113 = ((float)local_418._8_4_ + (float)local_418._12_4_) * 0.5;
                  fVar112 = (aIStack_408[0].low + aIStack_408[0].high) * 0.5;
                  local_468._0_4_ = fVar112;
                  auVar86 = ZEXT816(0) << 0x40;
                  bVar84 = false;
                  uVar79 = 0;
                  do {
                    fVar216 = local_318._0_4_;
                    if ((uVar79 != 0) && (fVar216 = local_458._0_4_, uVar79 != 1)) {
                      fVar216 = local_348._0_4_;
                    }
                    pvVar80 = &this_03->values;
                    if ((uVar79 != 0) &&
                       (pvVar80 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                                  ((long)&(this_03->values).alloc.memoryResource + 4), uVar79 != 1))
                    {
                      pvVar80 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                                &(this_03->values).ptr;
                    }
                    fVar156 = fVar114;
                    if ((uVar79 != 0) && (fVar156 = fVar113, uVar79 != 1)) {
                      fVar156 = fVar112;
                    }
                    psVar81 = (size_t *)((long)&(this_03->values).ptr + 4);
                    if ((uVar79 != 0) && (psVar81 = &(this_03->values).nAlloc, uVar79 != 1)) {
                      psVar81 = (size_t *)((long)&(this_03->values).nAlloc + 4);
                    }
                    fVar200 = fVar114;
                    if ((uVar79 != 0) && (fVar200 = fVar113, uVar79 != 1)) {
                      fVar200 = fVar112;
                    }
                    auVar202 = ZEXT464(0x3f800000);
                    auVar91 = ZEXT416((uint)((1.0 / fVar216) * (*(float *)psVar81 - fVar200)));
                    auVar160 = ZEXT416((uint)((1.0 / fVar216) *
                                             (*(float *)&(pvVar80->alloc).memoryResource - fVar156))
                                      );
                    auVar87 = vminss_avx(auVar91,auVar160);
                    auVar86 = vmaxss_avx(auVar87,auVar86);
                    auVar87 = vmaxss_avx(auVar160,auVar91);
                    auVar87 = vminss_avx(ZEXT416((uint)(auVar87._0_4_ * 1.0000004)),
                                         ZEXT416((uint)local_4e8._0_4_));
                    auVar186 = ZEXT856(auVar87._8_8_);
                    local_4e8._0_4_ = auVar87._0_4_;
                    fVar216 = auVar86._0_4_;
                    if (auVar87._0_4_ < fVar216) break;
                    bVar84 = 1 < uVar79;
                    uVar79 = uVar79 + 1;
                  } while (uVar79 != 3);
                  local_418._8_8_ = puVar61;
                  aIStack_408[0] = IVar116;
                  if (bVar84) {
                    fVar112 = *(float *)&this_03[2].values.nStored;
                    uStack_540 = 0;
                    unique0x10009315 = puVar60;
                    SVar225 = DenselySampledSpectrum::Sample
                                        ((DenselySampledSpectrum *)&(this_03->values).nStored,lambda
                                        );
                    auVar182._0_8_ = SVar225.values.values._8_8_;
                    auVar182._8_56_ = auVar186;
                    local_548 = (undefined1  [8])SVar225.values.values._0_8_;
                    fVar156 = *(float *)&this_03[2].values.nStored;
                    auVar155 = (undefined1  [56])0x0;
                    SVar225 = DenselySampledSpectrum::Sample
                                        ((DenselySampledSpectrum *)&this_03[1].values.nStored,lambda
                                        );
                    auVar183._0_8_ = SVar225.values.values._8_8_;
                    auVar183._8_56_ = auVar186;
                    auVar152._0_8_ = SVar225.values.values._0_8_;
                    auVar152._8_56_ = auVar155;
                    auVar86 = vunpcklpd_avx(_local_548,auVar182._0_16_);
                    local_1e8._0_4_ = fVar112 * auVar86._0_4_;
                    local_1e8._4_4_ = fVar112 * auVar86._4_4_;
                    fStack_1e0 = fVar112 * auVar86._8_4_;
                    fStack_1dc = fVar112 * auVar86._12_4_;
                    auVar86 = vmovlhps_avx(auVar152._0_16_,auVar183._0_16_);
                    local_1f8._0_4_ = fVar156 * auVar86._0_4_;
                    local_1f8._4_4_ = fVar156 * auVar86._4_4_;
                    fStack_1f0 = fVar156 * auVar86._8_4_;
                    fStack_1ec = fVar156 * auVar86._12_4_;
                    local_248._0_4_ = (float)local_1f8._0_4_ + (float)local_1e8._0_4_;
                    local_248._4_4_ = (float)local_1f8._4_4_ + (float)local_1e8._4_4_;
                    local_248._8_4_ = fStack_1f0 + fStack_1e0;
                    local_248._12_4_ = fStack_1ec + fStack_1dc;
                    auVar222 = ZEXT1664(local_248);
                    fVar112 = *(float *)&(this_03->values).alloc.memoryResource;
                    fVar156 = *(float *)((long)&(this_03->values).alloc.memoryResource + 4);
                    fVar193 = *(float *)((long)&(this_03->values).ptr + 4) - fVar112;
                    fVar201 = *(float *)&(this_03->values).nAlloc - fVar156;
                    fVar200 = *(float *)&(this_03->values).ptr;
                    fVar203 = *(float *)((long)&(this_03->values).nAlloc + 4) - fVar200;
                    local_4a4 = (float)local_318._0_4_ / fVar193;
                    local_4b8 = (float)local_458._0_4_ / fVar201;
                    local_4a8 = (float)local_348._0_4_ / fVar203;
                    fVar112 = (fVar114 - fVar112) / fVar193 + fVar216 * local_4a4;
                    fVar156 = (fVar113 - fVar156) / fVar201 + fVar216 * local_4b8;
                    fVar200 = ((float)local_468._0_4_ - fVar200) / fVar203 + fVar216 * local_4a8;
                    pvVar80 = &this_03[10].values;
                    fVar193 = 1.0 / (float)*(int *)&this_03[10].values.alloc.memoryResource;
                    pvVar2 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                             ((long)&this_03[10].values.alloc.memoryResource + 4);
                    fVar201 = 1.0 / (float)*(int *)((long)&this_03[10].values.alloc.memoryResource +
                                                   4);
                    auVar202 = ZEXT1664(ZEXT416((uint)fVar201));
                    ppfVar3 = &this_03[10].values.ptr;
                    fVar203 = 1.0 / (float)*(int *)&this_03[10].values.ptr;
                    lVar73 = 0;
                    do {
                      iVar85 = (int)lVar73;
                      pfVar83 = &local_4a4;
                      if ((iVar85 != 0) && (pfVar83 = &local_4a8, iVar85 == 1)) {
                        pfVar83 = &local_4b8;
                      }
                      if ((*pfVar83 == 0.0) && (!NAN(*pfVar83))) {
                        pfVar83 = &local_4a4;
                        if ((iVar85 != 0) && (pfVar83 = &local_4a8, iVar85 == 1)) {
                          pfVar83 = &local_4b8;
                        }
                        *pfVar83 = 0.0;
                      }
                      fVar207 = fVar112;
                      if ((iVar85 != 0) && (fVar207 = fVar156, iVar85 != 1)) {
                        fVar207 = fVar200;
                      }
                      pvVar76 = pvVar80;
                      if ((iVar85 != 0) && (pvVar76 = pvVar2, iVar85 != 1)) {
                        pvVar76 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)ppfVar3
                        ;
                      }
                      pvVar78 = pvVar80;
                      if ((iVar85 != 0) && (pvVar78 = pvVar2, iVar85 != 1)) {
                        pvVar78 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)ppfVar3
                        ;
                      }
                      auVar215._0_4_ = (float)(*(int *)&(pvVar78->alloc).memoryResource + -1);
                      auVar215._4_12_ = auVar223._4_12_;
                      auVar87 = ZEXT416((uint)(fVar207 *
                                              (float)*(int *)&(pvVar76->alloc).memoryResource));
                      auVar86 = vminss_avx(auVar215,auVar87);
                      uVar157 = vcmpss_avx512f(auVar87,ZEXT816(0) << 0x40,1);
                      auVar105._16_48_ = in_ZmmResult._16_48_;
                      auVar105._0_16_ = auVar86;
                      fVar207 = (float)((uint)!(bool)((byte)uVar157 & 1) * auVar86._0_4_);
                      in_ZmmResult._4_60_ = auVar105._4_60_;
                      in_ZmmResult._0_4_ = (int)fVar207;
                      iVar74 = (int)fVar207;
                      local_4b4[lVar73] = iVar74;
                      pfVar83 = &local_4a4;
                      if ((iVar85 != 0) && (pfVar83 = &local_4a8, iVar85 == 1)) {
                        pfVar83 = &local_4b8;
                      }
                      if (0.0 <= *pfVar83) {
                        pvVar76 = pvVar80;
                        if ((iVar85 != 0) && (pvVar76 = pvVar2, iVar85 != 1)) {
                          pvVar76 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                                    ppfVar3;
                        }
                        fVar207 = fVar112;
                        if ((iVar85 != 0) && (fVar207 = fVar156, iVar85 != 1)) {
                          fVar207 = fVar200;
                        }
                        pfVar83 = &local_4a4;
                        if ((iVar85 != 0) && (pfVar83 = &local_4a8, iVar85 == 1)) {
                          pfVar83 = &local_4b8;
                        }
                        *(float *)(local_4a0 + lVar73 * 4) =
                             fVar216 + ((float)(iVar74 + 1) /
                                        (float)*(int *)&(pvVar76->alloc).memoryResource - fVar207) /
                                       *pfVar83;
                        fVar207 = fVar193;
                        if ((iVar85 != 0) && (fVar207 = fVar201, iVar85 != 1)) {
                          fVar207 = fVar203;
                        }
                        pfVar83 = &local_4a4;
                        if ((iVar85 != 0) && (pfVar83 = &local_4a8, iVar85 == 1)) {
                          pfVar83 = &local_4b8;
                        }
                        afStack_324[lVar73] = fVar207 / *pfVar83;
                        aiStack_330[lVar73] = 1;
                        pvVar76 = pvVar80;
                        if ((iVar85 != 0) && (pvVar76 = pvVar2, iVar85 != 1)) {
                          pvVar76 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                                    ppfVar3;
                        }
                        iVar85 = *(int *)&(pvVar76->alloc).memoryResource;
                      }
                      else {
                        pvVar76 = pvVar80;
                        if ((iVar85 != 0) && (pvVar76 = pvVar2, iVar85 != 1)) {
                          pvVar76 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                                    ppfVar3;
                        }
                        fVar207 = fVar112;
                        if ((iVar85 != 0) && (fVar207 = fVar156, iVar85 != 1)) {
                          fVar207 = fVar200;
                        }
                        pfVar83 = &local_4a4;
                        if ((iVar85 != 0) && (pfVar83 = &local_4a8, iVar85 == 1)) {
                          pfVar83 = &local_4b8;
                        }
                        *(float *)(local_4a0 + lVar73 * 4) =
                             fVar216 + ((float)iVar74 /
                                        (float)*(int *)&(pvVar76->alloc).memoryResource - fVar207) /
                                       *pfVar83;
                        auVar86 = ZEXT416((uint)fVar193);
                        if ((iVar85 != 0) && (auVar86 = ZEXT416((uint)fVar201), iVar85 != 1)) {
                          auVar86 = ZEXT416((uint)fVar203);
                        }
                        pfVar83 = &local_4a4;
                        if ((iVar85 != 0) && (pfVar83 = &local_4a8, iVar85 == 1)) {
                          pfVar83 = &local_4b8;
                        }
                        auVar40._8_4_ = 0x80000000;
                        auVar40._0_8_ = 0x8000000080000000;
                        auVar40._12_4_ = 0x80000000;
                        in_ZmmResult._0_16_ = vxorps_avx512vl(auVar86,auVar40);
                        in_ZmmResult._16_48_ = auVar105._16_48_;
                        afStack_324[lVar73] = in_ZmmResult._0_4_ / *pfVar83;
                        aiStack_330[lVar73] = -1;
                        iVar85 = -1;
                      }
                      aiStack_274[lVar73] = iVar85;
                      lVar73 = lVar73 + 1;
                    } while (lVar73 != 3);
                    uVar79 = (uint)(local_4d8.state >> 0x2d) ^ (uint)(local_4d8.state >> 0x1b);
                    bVar72 = (byte)(local_4d8.state >> 0x3b);
                    auVar86 = vcvtusi2ss_avx512f(auVar223._0_16_,
                                                 uVar79 >> bVar72 | uVar79 << 0x20 - bVar72);
                    auVar86 = vminss_avx(ZEXT416((uint)(auVar86._0_4_ * 2.3283064e-10)),
                                         ZEXT416(0x3f7fffff));
                    local_568 = ZEXT416(auVar86._0_4_);
                    local_4d8.state = local_4d8.state * 0x5851f42d4c957f2d + local_4d8.inc;
                    puVar60 = stack0xfffffffffffffaf0;
                    do {
                      lVar73 = (long)*(int *)(&DAT_005e6660 +
                                             (ulong)((uint)((float)local_4a0._4_4_ < IStack_498.low)
                                                    | (uint)((float)local_4a0._0_4_ <
                                                            (float)local_4a0._4_4_) * 4 +
                                                      (uint)((float)local_4a0._0_4_ < IStack_498.low
                                                            ) * 2) * 4);
                      fVar112 = *(float *)(local_4a0 + lVar73 * 4);
                      uVar4 = *(undefined4 *)
                               (this_03[9].values.nAlloc +
                               (((long)local_4b4[2] *
                                 (long)*(int *)((long)&this_03[10].values.alloc.memoryResource + 4)
                                + (long)local_4b4[1]) *
                                (long)*(int *)&this_03[10].values.alloc.memoryResource +
                               (long)local_4b4[0]) * 4);
                      auVar41._4_4_ = uVar4;
                      auVar41._0_4_ = uVar4;
                      auVar41._8_4_ = uVar4;
                      auVar41._12_4_ = uVar4;
                      auVar106._16_48_ = in_ZmmResult._16_48_;
                      auVar106._0_16_ = vmulps_avx512vl(auVar222._0_16_,auVar41);
                      in_ZmmResult = auVar106;
                      if (auVar106._0_4_ <= 0.0) {
LAB_0041c3f2:
                        fVar156 = *(float *)(local_4a0 + lVar73 * 4);
                        if (((float)local_4e8._0_4_ < fVar156) ||
                           (iVar85 = local_4b4[lVar73],
                           local_4b4[lVar73] = iVar85 + aiStack_330[lVar73],
                           iVar85 + aiStack_330[lVar73] == aiStack_274[lVar73])) {
                          bVar84 = false;
                        }
                        else {
                          *(float *)(local_4a0 + lVar73 * 4) = fVar156 + afStack_324[lVar73];
                          bVar84 = true;
                          fVar216 = fVar112;
                        }
                      }
                      else {
                        auVar42._8_4_ = 0x80000000;
                        auVar42._0_8_ = 0x8000000080000000;
                        auVar42._12_4_ = 0x80000000;
                        auVar107._0_16_ = vxorps_avx512vl(auVar106._0_16_,auVar42);
                        auVar107._16_48_ = auVar106._16_48_;
                        in_ZmmResult = auVar107;
                        do {
                          local_548._0_4_ = auVar107._0_4_;
                          unique0x100093e5 = puVar60;
                          fVar156 = expf((fVar112 - fVar216) * (float)local_548._0_4_);
                          fVar156 = 1.0 - fVar156;
                          if (fVar156 <= (float)local_568._0_4_) {
                            auVar86 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                                                 ZEXT416((uint)(((float)local_568._0_4_ - fVar156) /
                                                               (1.0 - fVar156))));
                            local_568._0_4_ = auVar86._0_4_;
                            iVar85 = 8;
                            puVar60 = stack0xfffffffffffffaf0;
                          }
                          else {
                            fVar156 = logf(1.0 - (float)local_568._0_4_);
                            fVar156 = fVar216 - fVar156 / auVar106._0_4_;
                            auVar202 = ZEXT464((uint)fVar156);
                            if ((float)local_4e8._0_4_ <= fVar156) {
                              local_380 = false;
                              local_378.values.values[2] = 1.0;
                              local_378.values.values[0] = 1.0;
                              local_378.values.values[1] = 1.0;
                              local_378.values.values[3] = 1.0;
                              SampleLd::anon_class_32_4_b07b4888::operator()
                                        (&local_368,(MediumSample *)local_418);
                              if (local_380 == true) {
                                local_380 = false;
                              }
                              iVar85 = 1;
                              puVar60 = stack0xfffffffffffffaf0;
                            }
                            else {
                              auVar86 = vinsertps_avx(ZEXT416((uint)(fVar156 * (float)local_318.
                                                                                      _0_4_ +
                                                                    fVar114)),
                                                      ZEXT416((uint)(fVar156 * (float)local_458.
                                                                                      _0_4_ +
                                                                    fVar113)),0x10);
                              local_4c8.z = fVar156 * (float)local_348._0_4_ +
                                            (float)local_468._0_4_;
                              local_4c8._0_8_ = vmovlps_avx(auVar86);
                              local_2b8._0_4_ = fVar156;
                              fVar156 = fVar156 - fVar216;
                              local_548._4_4_ = auVar107._4_4_;
                              uStack_540._0_4_ = auVar107._8_4_;
                              uStack_540._4_4_ = auVar107._12_4_;
                              auVar127._0_4_ = fVar156 * (float)local_548._0_4_;
                              auVar127._4_4_ = fVar156 * (float)local_548._4_4_;
                              auVar127._8_4_ = fVar156 * (float)uStack_540;
                              auVar127._12_4_ = fVar156 * uStack_540._4_4_;
                              auVar43._8_4_ = 0x3fb8aa3b;
                              auVar43._0_8_ = 0x3fb8aa3b3fb8aa3b;
                              auVar43._12_4_ = 0x3fb8aa3b;
                              auVar111 = in_ZmmResult._16_48_;
                              auVar86 = vmulps_avx512vl(auVar127,auVar43);
                              _local_2f8 = vroundps_avx(auVar86,9);
                              auVar86 = vsubps_avx(auVar86,_local_2f8);
                              auVar186 = ZEXT856(auVar86._8_8_);
                              auVar168._8_4_ = 0x3da1d5b6;
                              auVar168._0_8_ = 0x3da1d5b63da1d5b6;
                              auVar168._12_4_ = 0x3da1d5b6;
                              auVar44._8_4_ = 0x3e658299;
                              auVar44._0_8_ = 0x3e6582993e658299;
                              auVar44._12_4_ = 0x3e658299;
                              auVar87 = vfmadd213ps_avx512vl(auVar168,auVar86,auVar44);
                              auVar45._8_4_ = 0x3f3263b7;
                              auVar45._0_8_ = 0x3f3263b73f3263b7;
                              auVar45._12_4_ = 0x3f3263b7;
                              auVar87 = vfmadd213ps_avx512vl(auVar87,auVar86,auVar45);
                              auVar46._8_4_ = 0x3f7ff3bf;
                              auVar46._0_8_ = 0x3f7ff3bf3f7ff3bf;
                              auVar46._12_4_ = 0x3f7ff3bf;
                              local_438 = vfmadd213ps_avx512vl(auVar87,auVar86,auVar46);
                              auVar155 = ZEXT856(local_438._8_8_);
                              SVar225 = NanoVDBMediumProvider::Density
                                                  (*(NanoVDBMediumProvider **)this_03,
                                                   (Point3f *)&local_4c8,lambda);
                              auVar184._0_8_ = SVar225.values.values._8_8_;
                              auVar184._8_56_ = auVar155;
                              auVar153._0_8_ = SVar225.values.values._0_8_;
                              auVar153._8_56_ = auVar186;
                              local_448 = auVar153._0_16_;
                              local_308 = auVar184._0_16_;
                              SVar225 = NanoVDBMediumProvider::Le
                                                  (*(NanoVDBMediumProvider **)this_03,
                                                   (Point3f *)&local_4c8,lambda);
                              auVar185._0_8_ = SVar225.values.values._8_8_;
                              auVar185._8_56_ = auVar155;
                              auVar154._0_8_ = SVar225.values.values._0_8_;
                              auVar154._8_56_ = auVar186;
                              auVar86 = vfmadd231ss_fma(ZEXT416((uint)(local_4c8.y *
                                                                      *(float *)((long)&this_03[6].
                                                                                        values.alloc
                                                                                        .
                                                  memoryResource + 4))),ZEXT416((uint)local_4c8.x),
                                                  ZEXT416(*(uint *)&this_03[6].values.alloc.
                                                                    memoryResource));
                              auVar86 = vfmadd231ss_fma(auVar86,ZEXT416((uint)local_4c8.z),
                                                        ZEXT416(*(uint *)&this_03[6].values.ptr));
                              fVar156 = auVar86._0_4_ + *(float *)((long)&this_03[6].values.ptr + 4)
                              ;
                              auVar86 = vfmadd231ss_fma(ZEXT416((uint)(local_4c8.y *
                                                                      *(float *)((long)&this_03[6].
                                                                                        values.
                                                  nAlloc + 4))),ZEXT416((uint)local_4c8.x),
                                                  ZEXT416((uint)this_03[6].values.nAlloc));
                              auVar86 = vfmadd231ss_fma(auVar86,ZEXT416((uint)local_4c8.z),
                                                        ZEXT416((uint)this_03[6].values.nStored));
                              fVar200 = auVar86._0_4_ +
                                        *(float *)((long)&this_03[6].values.nStored + 4);
                              auVar86 = vfmadd231ss_fma(ZEXT416((uint)(local_4c8.y *
                                                                      (float)this_03[7].lambda_max))
                                                        ,ZEXT416((uint)local_4c8.x),
                                                        ZEXT416((uint)this_03[7].lambda_min));
                              auVar86 = vfmadd231ss_fma(auVar86,ZEXT416((uint)local_4c8.z),
                                                        ZEXT416(*(uint *)&this_03[7].values.alloc.
                                                                          memoryResource));
                              fVar193 = auVar86._0_4_ +
                                        *(float *)((long)&this_03[7].values.alloc.memoryResource + 4
                                                  );
                              auVar86 = vfmadd231ss_fma(ZEXT416((uint)(local_4c8.y *
                                                                      *(float *)((long)&this_03[7].
                                                                                        values.ptr +
                                                                                4))),
                                                        ZEXT416((uint)local_4c8.x),
                                                        ZEXT416(*(uint *)&this_03[7].values.ptr));
                              auVar86 = vfmadd231ss_fma(auVar86,ZEXT416((uint)local_4c8.z),
                                                        ZEXT416((uint)this_03[7].values.nAlloc));
                              fVar201 = auVar86._0_4_ +
                                        *(float *)((long)&this_03[7].values.nAlloc + 4);
                              bVar84 = fVar201 == 1.0;
                              auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fStack_508 * fStack_508)),
                                                        ZEXT416((uint)fStack_50c),
                                                        ZEXT416((uint)fStack_50c));
                              auVar86 = vfmadd213ss_fma(ZEXT416((uint)fStack_504),
                                                        ZEXT416((uint)fStack_504),auVar86);
                              if (auVar86._0_4_ < 0.0) {
                                local_228 = ZEXT416((uint)fVar156);
                                local_238 = ZEXT416((uint)fVar200);
                                local_268 = ZEXT416((uint)fVar193);
                                local_46c = fVar201;
                                local_218 = auVar185._0_16_;
                                local_208 = auVar154._0_16_;
                                fVar203 = sqrtf(auVar86._0_4_);
                                fVar201 = local_46c;
                                auVar87 = local_228;
                                auVar91 = local_268;
                                auVar86 = local_208;
                                fVar200 = (float)local_238._0_4_;
                                auVar160 = local_218;
                                puVar60 = stack0xfffffffffffffaf0;
                              }
                              else {
                                auVar86 = vsqrtss_avx(auVar86,auVar86);
                                fVar203 = auVar86._0_4_;
                                auVar87 = ZEXT416((uint)fVar156);
                                auVar91 = ZEXT416((uint)fVar193);
                                auVar86 = auVar154._0_16_;
                                auVar160 = auVar185._0_16_;
                                puVar60 = stack0xfffffffffffffaf0;
                              }
                              fStack_50c = (float)((ulong)puVar60 >> 0x20);
                              auVar224 = ZEXT1664(auVar86);
                              auVar191._0_4_ = (int)(float)local_2f8._0_4_;
                              auVar191._4_4_ = (int)(float)local_2f8._4_4_;
                              auVar191._8_4_ = (int)fStack_2f0;
                              auVar191._12_4_ = (int)fStack_2ec;
                              auVar47._8_4_ = 0xffffffe1;
                              auVar47._0_8_ = 0xffffffe1ffffffe1;
                              auVar47._12_4_ = 0xffffffe1;
                              uVar75 = vpcmpgtd_avx512vl(auVar191,auVar47);
                              uVar75 = uVar75 & 0xf;
                              auVar48._8_4_ = 0x1e;
                              auVar48._0_8_ = 0x1e0000001e;
                              auVar48._12_4_ = 0x1e;
                              uVar77 = vpcmpgtd_avx512vl(auVar191,auVar48);
                              uVar77 = uVar77 & 0xf;
                              auVar188 = vpslld_avx(auVar191,0x17);
                              auVar188 = vpaddd_avx(auVar188,local_438);
                              auVar88 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                              bVar9 = (bool)((byte)uVar77 & 1);
                              auVar92._0_4_ =
                                   (uint)bVar9 * auVar88._0_4_ |
                                   (uint)!bVar9 * (uint)((byte)uVar75 & 1) * auVar188._0_4_;
                              bVar9 = (bool)((byte)(uVar77 >> 1) & 1);
                              auVar92._4_4_ =
                                   (uint)bVar9 * auVar88._4_4_ |
                                   (uint)!bVar9 * (uint)((byte)(uVar75 >> 1) & 1) * auVar188._4_4_;
                              bVar9 = (bool)((byte)(uVar77 >> 2) & 1);
                              auVar92._8_4_ =
                                   (uint)bVar9 * auVar88._8_4_ |
                                   (uint)!bVar9 * (uint)((byte)(uVar75 >> 2) & 1) * auVar188._8_4_;
                              bVar9 = SUB81(uVar77 >> 3,0);
                              auVar92._12_4_ =
                                   (uint)bVar9 * auVar88._12_4_ |
                                   (uint)!bVar9 * (uint)(byte)(uVar75 >> 3) * auVar188._12_4_;
                              auVar88 = vshufpd_avx(auVar92,auVar92,1);
                              auVar188 = vmovlhps_avx(local_448,local_308);
                              fVar156 = auVar87._0_4_ / fVar201;
                              auVar109._4_12_ = auVar87._4_12_;
                              auVar109._0_4_ = fVar156;
                              fVar193 = auVar91._0_4_ / fVar201;
                              auVar110._4_12_ = auVar91._4_12_;
                              auVar110._0_4_ = fVar193;
                              auVar109._16_48_ = auVar111;
                              auVar108._4_60_ = auVar109._4_60_;
                              auVar108._0_4_ =
                                   (uint)bVar84 * (int)auVar87._0_4_ + (uint)!bVar84 * (int)fVar156;
                              iVar85 = (uint)bVar84 * (int)fVar200 +
                                       (uint)!bVar84 * (int)(fVar200 / fVar201);
                              auVar110._16_48_ = auVar111;
                              in_ZmmResult._4_60_ = auVar110._4_60_;
                              in_ZmmResult._0_4_ =
                                   (uint)bVar84 * (int)auVar91._0_4_ + (uint)!bVar84 * (int)fVar193;
                              aIStack_408[9].low = auVar188._0_4_ * (float)local_1e8._0_4_;
                              aIStack_408[9].high = auVar188._4_4_ * (float)local_1e8._4_4_;
                              aIStack_408[10].low = auVar188._8_4_ * fStack_1e0;
                              aIStack_408[10].high = auVar188._12_4_ * fStack_1dc;
                              aIStack_408[0xb].low = auVar188._0_4_ * (float)local_1f8._0_4_;
                              aIStack_408[0xb].high = auVar188._4_4_ * (float)local_1f8._4_4_;
                              aIStack_408[0xc].low = auVar188._8_4_ * fStack_1f0;
                              aIStack_408[0xc].high = auVar188._12_4_ * fStack_1ec;
                              auVar223 = ZEXT1664(CONCAT412(0x80000000,
                                                            CONCAT48(0x80000000,0x8000000080000000))
                                                 );
                              aIStack_408[2].high = -fStack_504 / fVar203;
                              auVar221._0_8_ = CONCAT44(fStack_508,fStack_50c) ^ 0x8000000080000000;
                              auVar221._8_4_ = 0x80000000;
                              auVar221._12_4_ = 0x80000000;
                              auVar128._4_4_ = fVar203;
                              auVar128._0_4_ = fVar203;
                              auVar128._8_4_ = fVar203;
                              auVar128._12_4_ = fVar203;
                              auVar87 = vdivps_avx(auVar221,auVar128);
                              auVar206._4_4_ = iVar85;
                              auVar206._0_4_ = iVar85;
                              auVar206._8_4_ = iVar85;
                              auVar206._12_4_ = iVar85;
                              auVar211._4_4_ = in_ZmmResult._0_4_;
                              auVar211._0_4_ = in_ZmmResult._0_4_;
                              auVar211._8_4_ = in_ZmmResult._0_4_;
                              auVar211._12_4_ = in_ZmmResult._0_4_;
                              aIStack_408._24_16_ =
                                   ZEXT416((uint)(auVar221._0_8_ >> 0x20) ^ (uint)-fStack_508) <<
                                   0x20;
                              aIStack_408[5].low = 0.0;
                              local_380 = true;
                              auVar91 = vshufps_avx(auVar108._0_16_,auVar206,0x40);
                              auVar202 = ZEXT1664(auVar91);
                              local_418._0_4_ = auVar91._0_4_;
                              local_418._4_4_ = auVar91._4_4_;
                              local_418._8_4_ = auVar91._8_4_;
                              local_418._12_4_ = auVar91._12_4_;
                              uVar157 = vmovlps_avx(auVar211);
                              aIStack_408[0].low = (float)uVar157;
                              aIStack_408[0].high = (float)((ulong)uVar157 >> 0x20);
                              aIStack_408[1].low = fStack_500;
                              uVar157 = vmovlps_avx(auVar87);
                              aIStack_408[1].high = (float)uVar157;
                              aIStack_408[2].low = (float)((ulong)uVar157 >> 0x20);
                              aIStack_408[6].low = 0.0;
                              aIStack_408[6].high = 0.0;
                              aIStack_408._120_16_ = vmovlhps_avx(auVar86,auVar160);
                              local_378.values.values =
                                   (array<float,_4>)vunpcklpd_avx(auVar92,auVar88);
                              aIStack_408[7] = (Interval<float>)((ulong)this_03 | 0x4000000000000);
                              aIStack_408[8] =
                                   (Interval<float>)
                                   ((ulong)((long)&this_03[2].values.nStored + 4U) | 0x1000000000000
                                   );
                              aIStack_408._104_16_ = auVar106._0_16_;
                              unique0x100094ed = puVar60;
                              bVar84 = SampleLd::anon_class_32_4_b07b4888::operator()
                                                 (&local_368,(MediumSample *)local_418);
                              aVar63._4_4_ = local_418._4_4_;
                              aVar63._0_4_ = local_418._0_4_;
                              if (local_380 == true) {
                                local_380 = false;
                              }
                              iVar85 = 1;
                              local_418._8_8_ =
                                   (undefined1 *)CONCAT44(local_418._12_4_,local_418._8_4_);
                              aIStack_408[0] =
                                   (Interval<float>)CONCAT44(aIStack_408[0].high,aIStack_408[0].low)
                              ;
                              aIStack_408[1] =
                                   (Interval<float>)CONCAT44(aIStack_408[1].high,aIStack_408[1].low)
                              ;
                              puVar60 = stack0xfffffffffffffaf0;
                              if (bVar84) {
                                uVar79 = (uint)(local_4d8.state >> 0x2d) ^
                                         (uint)(local_4d8.state >> 0x1b);
                                bVar72 = (byte)(local_4d8.state >> 0x3b);
                                auVar86 = vcvtusi2ss_avx512f(in_XMM15,uVar79 >> bVar72 |
                                                                      uVar79 << 0x20 - bVar72);
                                auVar86 = vminss_avx(ZEXT416((uint)(auVar86._0_4_ * 2.3283064e-10)),
                                                     ZEXT416(0x3f7fffff));
                                local_568._0_4_ = auVar86._0_4_;
                                iVar85 = 0;
                                local_4d8.state =
                                     local_4d8.state * 0x5851f42d4c957f2d + local_4d8.inc;
                                fVar216 = (float)local_2b8._0_4_;
                                local_418._0_8_ = aVar63;
                                local_418._8_8_ =
                                     (undefined1 *)CONCAT44(local_418._12_4_,local_418._8_4_);
                                aIStack_408[0] =
                                     (Interval<float>)
                                     CONCAT44(aIStack_408[0].high,aIStack_408[0].low);
                                aIStack_408[1] =
                                     (Interval<float>)
                                     CONCAT44(aIStack_408[1].high,aIStack_408[1].low);
                              }
                            }
                          }
                        } while (iVar85 == 0);
                        if (iVar85 == 8) {
                          auVar222 = ZEXT1664(local_248);
                          goto LAB_0041c3f2;
                        }
                        bVar84 = false;
                        auVar222 = ZEXT1664(local_248);
                      }
                      pVVar82 = local_420;
                    } while (bVar84);
                  }
                }
              }
              if ((local_2d8 == 0.0) && (!NAN(local_2d8))) {
                uVar75 = 0;
                while (uVar77 = uVar75, uVar77 != 3) {
                  if ((afStack_2d4[uVar77] != 0.0) ||
                     (uVar75 = uVar77 + 1, NAN(afStack_2d4[uVar77]))) break;
                }
                iVar85 = 1;
                if (2 < uVar77) goto LAB_0041c524;
              }
              iVar85 = 3;
              if (local_d8._0_1_ == true) {
                auVar202 = ZEXT1664(auVar202._0_16_);
                auVar223 = ZEXT1664(auVar223._0_16_);
                auVar224 = ZEXT1664(auVar224._0_16_);
                unique0x100091f5 = puVar60;
                Interaction::SpawnRayTo((Ray *)local_418,(Interaction *)local_1d8,&local_80);
                local_518._0_8_ = local_418._0_8_;
                fStack_508 = aIStack_408[0].low;
                fStack_500 = aIStack_408[0].low;
                fStack_504 = aIStack_408[0].high;
                local_4f8.bits = CONCAT44(aIStack_408[2].high,aIStack_408[2].low);
                iVar85 = 0;
                puVar60 = (undefined1 *)local_418._8_8_;
              }
            }
LAB_0041c524:
            auVar222 = _local_1d8;
            if (local_d8._0_1_ == true) {
              local_d8 = local_d8 & 0xffffffffffffff00;
            }
          } while (iVar85 == 0);
          if (iVar85 == 3) {
            local_2e8.values.values[0] =
                 (float)local_b8._0_4_ * (pathPDF->values).values[0] * local_2e8.values.values[0];
            local_2e8.values.values[1] =
                 (float)local_b8._0_4_ * (pathPDF->values).values[1] * local_2e8.values.values[1];
            local_2e8.values.values[2] =
                 (float)local_b8._0_4_ * (pathPDF->values).values[2] * local_2e8.values.values[2];
            local_2e8.values.values[3] =
                 (float)local_b8._0_4_ * (pathPDF->values).values[3] * local_2e8.values.values[3];
            if (*(uint *)((ulong)local_d0 & 0xffffffffffff) < 2) {
              auVar130._0_4_ = local_a8 * (float)local_2c8 * local_2d8;
              auVar130._4_4_ = afStack_a4[0] * local_2c8._4_4_ * afStack_2d4[0];
              auVar130._8_4_ = afStack_a4[1] * (float)uStack_2c0 * afStack_2d4[1];
              auVar130._12_4_ = afStack_a4[2] * uStack_2c0._4_4_ * afStack_2d4[2];
              lVar73 = 1;
              do {
                local_2e8.values.values[0] =
                     local_2e8.values.values[0] + local_2e8.values.values[lVar73];
                lVar73 = lVar73 + 1;
              } while (lVar73 != 4);
            }
            else {
              local_258.values.values[0] =
                   local_c8 * (pathPDF->values).values[0] * local_258.values.values[0];
              local_258.values.values[1] =
                   local_c8 * (pathPDF->values).values[1] * local_258.values.values[1];
              local_258.values.values[2] =
                   local_c8 * (pathPDF->values).values[2] * local_258.values.values[2];
              local_258.values.values[3] =
                   local_c8 * (pathPDF->values).values[3] * local_258.values.values[3];
              auVar130._0_4_ = local_a8 * (float)local_2c8 * local_2d8;
              auVar130._4_4_ = afStack_a4[0] * local_2c8._4_4_ * afStack_2d4[0];
              auVar130._8_4_ = afStack_a4[1] * (float)uStack_2c0 * afStack_2d4[1];
              auVar130._12_4_ = afStack_a4[2] * uStack_2c0._4_4_ * afStack_2d4[2];
              local_2e8.values.values[0] = local_258.values.values[0] + local_2e8.values.values[0];
              fStack_1d4 = local_258.values.values[1] + local_2e8.values.values[1];
              local_1d8 = (undefined1  [4])local_2e8.values.values[0];
              IStack_1d0.low = local_258.values.values[2] + local_2e8.values.values[2];
              _IStack_1c8 = auVar222._16_48_;
              IStack_1d0.high = local_258.values.values[3] + local_2e8.values.values[3];
              lVar73 = 1;
              do {
                local_2e8.values.values[0] =
                     local_2e8.values.values[0] + *(float *)(local_1d8 + lVar73 * 4);
                lVar73 = lVar73 + 1;
              } while (lVar73 != 4);
            }
            local_2e8.values.values[0] = local_2e8.values.values[0] * 0.25;
            auVar170._4_4_ = local_2e8.values.values[0];
            auVar170._0_4_ = local_2e8.values.values[0];
            auVar170._8_4_ = local_2e8.values.values[0];
            auVar170._12_4_ = local_2e8.values.values[0];
            auVar86 = vdivps_avx(auVar130,auVar170);
            uVar115 = auVar86._0_8_;
            auVar86 = vshufpd_avx(auVar86,auVar86,1);
            uVar157 = auVar86._0_8_;
            goto LAB_0041c67d;
          }
        }
        uVar157 = 0;
        uVar115 = 0;
        goto LAB_0041c67d;
      }
    }
    LogFatal<char_const(&)[43]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp"
               ,0x50a,"Check failed: %s",(char (*) [43])"light != nullptr && sampledLight->pdf != 0"
              );
  }
LAB_0041c67d:
  SVar225.values.values[2] = (float)(int)uVar157;
  SVar225.values.values[3] = (float)(int)((ulong)uVar157 >> 0x20);
  SVar225.values.values[0] = (float)(int)uVar115;
  SVar225.values.values[1] = (float)(int)((ulong)uVar115 >> 0x20);
  return (SampledSpectrum)SVar225.values.values;
}

Assistant:

SampledSpectrum VolPathIntegrator::SampleLd(const Interaction &intr, const BSDF *bsdf,
                                            SampledWavelengths &lambda,
                                            SamplerHandle sampler,
                                            const SampledSpectrum &beta,
                                            const SampledSpectrum &pathPDF) const {
    // Sample a light source using _lightSampler_
    Float u = sampler.Get1D();
    pstd::optional<SampledLight> sampledLight =
        bsdf ? lightSampler.Sample(intr.AsSurface(), u) : lightSampler.Sample(intr, u);
    Point2f uLight = sampler.Get2D();
    if (!sampledLight)
        return SampledSpectrum(0.f);
    LightHandle light = sampledLight->light;
    CHECK(light != nullptr && sampledLight->pdf != 0);

    // Sample a point on the light source
    LightSampleContext ctx;
    if (bsdf)
        ctx = LightSampleContext(intr.AsSurface());
    else
        ctx = LightSampleContext(intr);
    LightLiSample ls = light.SampleLi(ctx, uLight, lambda, LightSamplingMode::WithMIS);
    if (!ls || !ls.L)
        return SampledSpectrum(0.f);
    Float lightPDF = sampledLight->pdf * ls.pdf;

    // Evaluate BSDF or phase function for light sample direction
    Float scatterPDF;
    SampledSpectrum betaLight = beta;
    Vector3f wo = intr.wo, wi = ls.wi;
    if (bsdf) {
        // Update _bsdfLight_ and _scatterPDF_ accounting for the BSDF
        betaLight *= bsdf->f(wo, wi) * AbsDot(wi, intr.AsSurface().shading.n);
        scatterPDF = bsdf->PDF(wo, wi);

    } else {
        // Update _bsdfLight_ and _scatterPDF_ accounting for the phase function
        CHECK(intr.IsMediumInteraction());
        PhaseFunctionHandle phase = intr.AsMedium().phase;
        betaLight *= phase.p(wo, wi);
        scatterPDF = phase.PDF(wo, wi);
    }
    if (!betaLight)
        return SampledSpectrum(0.f);

    // Declare path state variables for ray to light source
    Ray lightRay = intr.SpawnRayTo(ls.pLight);
    SampledSpectrum throughput(1.f), pdfLight(1.f), pdfUni(1.f);
    RNG rng(Hash(lightRay.o), Hash(lightRay.d));

    while (true) {
        // Trace ray through media to estimate transmittance
        pstd::optional<ShapeIntersection> si = Intersect(lightRay, 1 - ShadowEpsilon);
        // Handle opaque surface along ray's path
        if (si && si->intr.material)
            return SampledSpectrum(0.f);

        // Update transmittance for current ray segment
        if (lightRay.medium != nullptr) {
            Float tMax = si ? si->tHit : (1 - ShadowEpsilon);
            lightRay.medium.SampleTmaj(
                lightRay, tMax, rng, lambda, [&](const MediumSample &mediumSample) {
                    // Account for medium scattering event along shadow ray
                    const SampledSpectrum &Tmaj = mediumSample.Tmaj;
                    if (!mediumSample.intr) {
                        // CO                        betaLight *= Tmaj;
                        return false;
                    }
                    const MediumInteraction &intr = *mediumSample.intr;
                    // Update _throughput_ and PDFs using ratio-tracking estimator
                    SampledSpectrum sigma_n = intr.sigma_n();
                    // ratio-tracking: only evaluate null scattering
                    throughput *= Tmaj * sigma_n;
                    pdfLight *= Tmaj * intr.sigma_maj;
                    pdfUni *= Tmaj * sigma_n;

                    Float pSurvive =
                        throughput.MaxComponentValue() / (pdfLight + pdfUni).Average();
                    if (pSurvive < .25f) {
                        if (rng.Uniform<Float>() > pSurvive)
                            throughput = SampledSpectrum(0.);
                        else
                            throughput /= pSurvive;
                    }

                    if (!throughput)
                        return false;
                    rescale(throughput, pdfLight, pdfUni);
                    return true;
                });
        }

        // Generate next ray segment or return final transmittance
        if (!throughput)
            return SampledSpectrum(0.f);
        if (!si)
            break;
        lightRay = si->intr.SpawnRayTo(ls.pLight);
    }
    // Return weighted light contribution to direct lighting
    pdfLight *= pathPDF * lightPDF;  // p_nee in paper
    if (IsDeltaLight(light.Type()))
        // pdfUni unused...
        return betaLight * ls.L * throughput / pdfLight.Average();
    else {
        pdfUni *= pathPDF * scatterPDF;
        return betaLight * ls.L * throughput / (pdfLight + pdfUni).Average();
    }
}